

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiMBIntersector1<8>::
     occluded_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int iVar21;
  long lVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [12];
  ulong uVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  byte bVar80;
  uint uVar81;
  undefined1 (*pauVar82) [32];
  uint uVar83;
  uint uVar84;
  long lVar85;
  ulong uVar86;
  bool bVar87;
  int iVar88;
  ulong uVar89;
  bool bVar90;
  undefined4 uVar91;
  undefined8 uVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar149 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar103 [16];
  undefined1 auVar114 [32];
  undefined1 auVar110 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  undefined1 auVar111 [32];
  undefined1 auVar117 [64];
  float fVar118;
  float fVar141;
  float fVar142;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar147 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar148 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar189;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar190;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [28];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar209;
  float fVar222;
  float fVar223;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  float fVar247;
  float fVar248;
  undefined1 in_ZMM10 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  float fVar249;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 in_ZMM11 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_b44;
  int local_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  RTCFilterFunctionNArguments local_a10;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined8 local_920;
  undefined4 local_918;
  float local_914;
  undefined4 local_910;
  undefined4 local_90c;
  uint local_908;
  uint local_904;
  uint local_900;
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  undefined1 auStack_8b0 [16];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [16];
  undefined1 auStack_870 [16];
  undefined1 local_860 [16];
  Primitive *local_850;
  ulong local_848;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 auStack_7b0 [16];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  uint local_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  uint uStack_664;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [32];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  PVar9 = prim[1];
  uVar89 = (ulong)(byte)PVar9;
  lVar22 = uVar89 * 0x25;
  fVar118 = *(float *)(prim + lVar22 + 0x12);
  auVar149 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar22 + 6));
  auVar147._0_4_ = fVar118 * (ray->dir).field_0.m128[0];
  auVar147._4_4_ = fVar118 * (ray->dir).field_0.m128[1];
  auVar147._8_4_ = fVar118 * (ray->dir).field_0.m128[2];
  auVar147._12_4_ = fVar118 * (ray->dir).field_0.m128[3];
  auVar93._0_4_ = fVar118 * auVar149._0_4_;
  auVar93._4_4_ = fVar118 * auVar149._4_4_;
  auVar93._8_4_ = fVar118 * auVar149._8_4_;
  auVar93._12_4_ = fVar118 * auVar149._12_4_;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = *(ulong *)(prim + uVar89 * 4 + 6);
  auVar135 = vpmovsxbd_avx2(auVar149);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar89 * 5 + 6);
  auVar104 = vpmovsxbd_avx2(auVar100);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar243._8_8_ = 0;
  auVar243._0_8_ = *(ulong *)(prim + uVar89 * 6 + 6);
  auVar157 = vpmovsxbd_avx2(auVar243);
  auVar157 = vcvtdq2ps_avx(auVar157);
  auVar213._8_8_ = 0;
  auVar213._0_8_ = *(ulong *)(prim + uVar89 * 0xf + 6);
  auVar17 = vpmovsxbd_avx2(auVar213);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar186 = vpmovsxbd_avx2(auVar4);
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar89 + 6);
  auVar18 = vpmovsxbd_avx2(auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar89 * 0x1a + 6);
  auVar19 = vpmovsxbd_avx2(auVar6);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar89 * 0x1b + 6);
  auVar158 = vpmovsxbd_avx2(auVar7);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar89 * 0x1c + 6);
  auVar20 = vpmovsxbd_avx2(auVar8);
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar235._4_4_ = auVar147._0_4_;
  auVar235._0_4_ = auVar147._0_4_;
  auVar235._8_4_ = auVar147._0_4_;
  auVar235._12_4_ = auVar147._0_4_;
  auVar235._16_4_ = auVar147._0_4_;
  auVar235._20_4_ = auVar147._0_4_;
  auVar235._24_4_ = auVar147._0_4_;
  auVar235._28_4_ = auVar147._0_4_;
  auVar149 = vmovshdup_avx(auVar147);
  uVar92 = auVar149._0_8_;
  auVar268._8_8_ = uVar92;
  auVar268._0_8_ = uVar92;
  auVar268._16_8_ = uVar92;
  auVar268._24_8_ = uVar92;
  auVar149 = vshufps_avx(auVar147,auVar147,0xaa);
  fVar118 = auVar149._0_4_;
  auVar252._0_4_ = fVar118 * auVar157._0_4_;
  fVar141 = auVar149._4_4_;
  auVar252._4_4_ = fVar141 * auVar157._4_4_;
  auVar252._8_4_ = fVar118 * auVar157._8_4_;
  auVar252._12_4_ = fVar141 * auVar157._12_4_;
  auVar252._16_4_ = fVar118 * auVar157._16_4_;
  auVar252._20_4_ = fVar141 * auVar157._20_4_;
  auVar252._28_36_ = in_ZMM11._28_36_;
  auVar252._24_4_ = fVar118 * auVar157._24_4_;
  auVar245._0_4_ = auVar18._0_4_ * fVar118;
  auVar245._4_4_ = auVar18._4_4_ * fVar141;
  auVar245._8_4_ = auVar18._8_4_ * fVar118;
  auVar245._12_4_ = auVar18._12_4_ * fVar141;
  auVar245._16_4_ = auVar18._16_4_ * fVar118;
  auVar245._20_4_ = auVar18._20_4_ * fVar141;
  auVar245._28_36_ = in_ZMM10._28_36_;
  auVar245._24_4_ = auVar18._24_4_ * fVar118;
  auVar183._0_4_ = auVar20._0_4_ * fVar118;
  auVar183._4_4_ = auVar20._4_4_ * fVar141;
  auVar183._8_4_ = auVar20._8_4_ * fVar118;
  auVar183._12_4_ = auVar20._12_4_ * fVar141;
  auVar183._16_4_ = auVar20._16_4_ * fVar118;
  auVar183._20_4_ = auVar20._20_4_ * fVar141;
  auVar183._24_4_ = auVar20._24_4_ * fVar118;
  auVar183._28_4_ = 0;
  auVar149 = vfmadd231ps_fma(auVar252._0_32_,auVar268,auVar104);
  auVar100 = vfmadd231ps_fma(auVar245._0_32_,auVar268,auVar186);
  auVar243 = vfmadd231ps_fma(auVar183,auVar158,auVar268);
  auVar213 = vfmadd231ps_fma(ZEXT1632(auVar149),auVar235,auVar135);
  auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar235,auVar17);
  auVar243 = vfmadd231ps_fma(ZEXT1632(auVar243),auVar19,auVar235);
  auVar236._4_4_ = auVar93._0_4_;
  auVar236._0_4_ = auVar93._0_4_;
  auVar236._8_4_ = auVar93._0_4_;
  auVar236._12_4_ = auVar93._0_4_;
  auVar236._16_4_ = auVar93._0_4_;
  auVar236._20_4_ = auVar93._0_4_;
  auVar236._24_4_ = auVar93._0_4_;
  auVar236._28_4_ = auVar93._0_4_;
  auVar149 = vmovshdup_avx(auVar93);
  uVar92 = auVar149._0_8_;
  auVar269._8_8_ = uVar92;
  auVar269._0_8_ = uVar92;
  auVar269._16_8_ = uVar92;
  auVar269._24_8_ = uVar92;
  auVar149 = vshufps_avx(auVar93,auVar93,0xaa);
  fVar118 = auVar149._0_4_;
  auVar154._0_4_ = fVar118 * auVar157._0_4_;
  fVar141 = auVar149._4_4_;
  auVar154._4_4_ = fVar141 * auVar157._4_4_;
  auVar154._8_4_ = fVar118 * auVar157._8_4_;
  auVar154._12_4_ = fVar141 * auVar157._12_4_;
  auVar154._16_4_ = fVar118 * auVar157._16_4_;
  auVar154._20_4_ = fVar141 * auVar157._20_4_;
  auVar154._24_4_ = fVar118 * auVar157._24_4_;
  auVar154._28_4_ = 0;
  auVar15._4_4_ = auVar18._4_4_ * fVar141;
  auVar15._0_4_ = auVar18._0_4_ * fVar118;
  auVar15._8_4_ = auVar18._8_4_ * fVar118;
  auVar15._12_4_ = auVar18._12_4_ * fVar141;
  auVar15._16_4_ = auVar18._16_4_ * fVar118;
  auVar15._20_4_ = auVar18._20_4_ * fVar141;
  auVar15._24_4_ = auVar18._24_4_ * fVar118;
  auVar15._28_4_ = auVar157._28_4_;
  auVar157._4_4_ = auVar20._4_4_ * fVar141;
  auVar157._0_4_ = auVar20._0_4_ * fVar118;
  auVar157._8_4_ = auVar20._8_4_ * fVar118;
  auVar157._12_4_ = auVar20._12_4_ * fVar141;
  auVar157._16_4_ = auVar20._16_4_ * fVar118;
  auVar157._20_4_ = auVar20._20_4_ * fVar141;
  auVar157._24_4_ = auVar20._24_4_ * fVar118;
  auVar157._28_4_ = fVar141;
  auVar149 = vfmadd231ps_fma(auVar154,auVar269,auVar104);
  auVar4 = vfmadd231ps_fma(auVar15,auVar269,auVar186);
  auVar5 = vfmadd231ps_fma(auVar157,auVar269,auVar158);
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar149),auVar236,auVar135);
  local_7e0._8_4_ = 0x7fffffff;
  local_7e0._0_8_ = 0x7fffffff7fffffff;
  local_7e0._12_4_ = 0x7fffffff;
  local_7e0._16_4_ = 0x7fffffff;
  local_7e0._20_4_ = 0x7fffffff;
  local_7e0._24_4_ = 0x7fffffff;
  local_7e0._28_4_ = 0x7fffffff;
  auVar182._8_4_ = 0x219392ef;
  auVar182._0_8_ = 0x219392ef219392ef;
  auVar182._12_4_ = 0x219392ef;
  auVar182._16_4_ = 0x219392ef;
  auVar182._20_4_ = 0x219392ef;
  auVar182._24_4_ = 0x219392ef;
  auVar182._28_4_ = 0x219392ef;
  auVar135 = vandps_avx(ZEXT1632(auVar213),local_7e0);
  auVar135 = vcmpps_avx(auVar135,auVar182,1);
  auVar104 = vblendvps_avx(ZEXT1632(auVar213),auVar182,auVar135);
  auVar135 = vandps_avx(ZEXT1632(auVar100),local_7e0);
  auVar135 = vcmpps_avx(auVar135,auVar182,1);
  auVar157 = vblendvps_avx(ZEXT1632(auVar100),auVar182,auVar135);
  auVar135 = vandps_avx(ZEXT1632(auVar243),local_7e0);
  auVar135 = vcmpps_avx(auVar135,auVar182,1);
  auVar135 = vblendvps_avx(ZEXT1632(auVar243),auVar182,auVar135);
  auVar147 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar236,auVar17);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar236,auVar19);
  fVar118 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar22 + 0x16)) *
            *(float *)(prim + lVar22 + 0x1a);
  auVar234._4_4_ = fVar118;
  auVar234._0_4_ = fVar118;
  auVar234._8_4_ = fVar118;
  auVar234._12_4_ = fVar118;
  auVar234._16_4_ = fVar118;
  auVar234._20_4_ = fVar118;
  auVar234._24_4_ = fVar118;
  auVar234._28_4_ = fVar118;
  auVar17 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 7 + 6));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar186 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0xb + 6));
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar186 = vsubps_avx(auVar186,auVar17);
  auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 9 + 6));
  auVar213 = vfmadd213ps_fma(auVar186,auVar234,auVar17);
  auVar186 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0xd + 6));
  auVar17 = vcvtdq2ps_avx(auVar18);
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar186 = vsubps_avx(auVar186,auVar17);
  auVar4 = vfmadd213ps_fma(auVar186,auVar234,auVar17);
  auVar17 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0x12 + 6));
  auVar17 = vcvtdq2ps_avx(auVar17);
  uVar86 = (ulong)(uint)((int)(uVar89 * 5) << 2);
  auVar186 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 2 + uVar86 + 6));
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar186 = vsubps_avx(auVar186,auVar17);
  auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 + 6));
  auVar5 = vfmadd213ps_fma(auVar186,auVar234,auVar17);
  auVar17 = vcvtdq2ps_avx(auVar18);
  auVar186 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0x18 + 6));
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar186 = vsubps_avx(auVar186,auVar17);
  auVar6 = vfmadd213ps_fma(auVar186,auVar234,auVar17);
  auVar245 = ZEXT1664(auVar6);
  auVar17 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0x1d + 6));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar186 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 + (ulong)(byte)PVar9 * 0x20 + 6));
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar186 = vsubps_avx(auVar186,auVar17);
  auVar7 = vfmadd213ps_fma(auVar186,auVar234,auVar17);
  auVar252 = ZEXT1664(auVar7);
  auVar17 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar9 * 0x20 - uVar89) + 6));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar186 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0x23 + 6));
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar186 = vsubps_avx(auVar186,auVar17);
  auVar8 = vfmadd213ps_fma(auVar186,auVar234,auVar17);
  auVar17 = vrcpps_avx(auVar104);
  auVar260._8_4_ = 0x3f800000;
  auVar260._0_8_ = 0x3f8000003f800000;
  auVar260._12_4_ = 0x3f800000;
  auVar260._16_4_ = 0x3f800000;
  auVar260._20_4_ = 0x3f800000;
  auVar260._24_4_ = 0x3f800000;
  auVar260._28_4_ = 0x3f800000;
  auVar149 = vfnmadd213ps_fma(auVar104,auVar17,auVar260);
  auVar149 = vfmadd132ps_fma(ZEXT1632(auVar149),auVar17,auVar17);
  auVar104 = vrcpps_avx(auVar157);
  auVar100 = vfnmadd213ps_fma(auVar157,auVar104,auVar260);
  auVar100 = vfmadd132ps_fma(ZEXT1632(auVar100),auVar104,auVar104);
  auVar104 = vrcpps_avx(auVar135);
  auVar243 = vfnmadd213ps_fma(auVar135,auVar104,auVar260);
  auVar243 = vfmadd132ps_fma(ZEXT1632(auVar243),auVar104,auVar104);
  auVar135 = vsubps_avx(ZEXT1632(auVar213),ZEXT1632(auVar93));
  auVar104 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar93));
  auVar17._4_4_ = auVar149._4_4_ * auVar135._4_4_;
  auVar17._0_4_ = auVar149._0_4_ * auVar135._0_4_;
  auVar17._8_4_ = auVar149._8_4_ * auVar135._8_4_;
  auVar17._12_4_ = auVar149._12_4_ * auVar135._12_4_;
  auVar17._16_4_ = auVar135._16_4_ * 0.0;
  auVar17._20_4_ = auVar135._20_4_ * 0.0;
  auVar17._24_4_ = auVar135._24_4_ * 0.0;
  auVar17._28_4_ = auVar135._28_4_;
  auVar186._4_4_ = auVar149._4_4_ * auVar104._4_4_;
  auVar186._0_4_ = auVar149._0_4_ * auVar104._0_4_;
  auVar186._8_4_ = auVar149._8_4_ * auVar104._8_4_;
  auVar186._12_4_ = auVar149._12_4_ * auVar104._12_4_;
  auVar186._16_4_ = auVar104._16_4_ * 0.0;
  auVar186._20_4_ = auVar104._20_4_ * 0.0;
  auVar186._24_4_ = auVar104._24_4_ * 0.0;
  auVar186._28_4_ = auVar104._28_4_;
  auVar135 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar147));
  auVar104 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar147));
  auVar18._4_4_ = auVar100._4_4_ * auVar135._4_4_;
  auVar18._0_4_ = auVar100._0_4_ * auVar135._0_4_;
  auVar18._8_4_ = auVar100._8_4_ * auVar135._8_4_;
  auVar18._12_4_ = auVar100._12_4_ * auVar135._12_4_;
  auVar18._16_4_ = auVar135._16_4_ * 0.0;
  auVar18._20_4_ = auVar135._20_4_ * 0.0;
  auVar18._24_4_ = auVar135._24_4_ * 0.0;
  auVar18._28_4_ = auVar135._28_4_;
  auVar19._4_4_ = auVar100._4_4_ * auVar104._4_4_;
  auVar19._0_4_ = auVar100._0_4_ * auVar104._0_4_;
  auVar19._8_4_ = auVar100._8_4_ * auVar104._8_4_;
  auVar19._12_4_ = auVar100._12_4_ * auVar104._12_4_;
  auVar19._16_4_ = auVar104._16_4_ * 0.0;
  auVar19._20_4_ = auVar104._20_4_ * 0.0;
  auVar19._24_4_ = auVar104._24_4_ * 0.0;
  auVar19._28_4_ = auVar104._28_4_;
  auVar135 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar94));
  auVar158._4_4_ = auVar243._4_4_ * auVar135._4_4_;
  auVar158._0_4_ = auVar243._0_4_ * auVar135._0_4_;
  auVar158._8_4_ = auVar243._8_4_ * auVar135._8_4_;
  auVar158._12_4_ = auVar243._12_4_ * auVar135._12_4_;
  auVar158._16_4_ = auVar135._16_4_ * 0.0;
  auVar158._20_4_ = auVar135._20_4_ * 0.0;
  auVar158._24_4_ = auVar135._24_4_ * 0.0;
  auVar158._28_4_ = auVar135._28_4_;
  auVar135 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar94));
  auVar20._4_4_ = auVar243._4_4_ * auVar135._4_4_;
  auVar20._0_4_ = auVar243._0_4_ * auVar135._0_4_;
  auVar20._8_4_ = auVar243._8_4_ * auVar135._8_4_;
  auVar20._12_4_ = auVar243._12_4_ * auVar135._12_4_;
  auVar20._16_4_ = auVar135._16_4_ * 0.0;
  auVar20._20_4_ = auVar135._20_4_ * 0.0;
  auVar20._24_4_ = auVar135._24_4_ * 0.0;
  auVar20._28_4_ = auVar135._28_4_;
  auVar135 = vpminsd_avx2(auVar17,auVar186);
  auVar104 = vpminsd_avx2(auVar18,auVar19);
  auVar135 = vmaxps_avx(auVar135,auVar104);
  auVar104 = vpminsd_avx2(auVar158,auVar20);
  uVar91 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar105._4_4_ = uVar91;
  auVar105._0_4_ = uVar91;
  auVar105._8_4_ = uVar91;
  auVar105._12_4_ = uVar91;
  auVar105._16_4_ = uVar91;
  auVar105._20_4_ = uVar91;
  auVar105._24_4_ = uVar91;
  auVar105._28_4_ = uVar91;
  auVar104 = vmaxps_avx(auVar104,auVar105);
  auVar135 = vmaxps_avx(auVar135,auVar104);
  local_340._4_4_ = auVar135._4_4_ * 0.99999964;
  local_340._0_4_ = auVar135._0_4_ * 0.99999964;
  local_340._8_4_ = auVar135._8_4_ * 0.99999964;
  local_340._12_4_ = auVar135._12_4_ * 0.99999964;
  local_340._16_4_ = auVar135._16_4_ * 0.99999964;
  local_340._20_4_ = auVar135._20_4_ * 0.99999964;
  local_340._24_4_ = auVar135._24_4_ * 0.99999964;
  local_340._28_4_ = auVar135._28_4_;
  auVar135 = vpmaxsd_avx2(auVar17,auVar186);
  auVar104 = vpmaxsd_avx2(auVar18,auVar19);
  auVar135 = vminps_avx(auVar135,auVar104);
  auVar104 = vpmaxsd_avx2(auVar158,auVar20);
  fVar118 = ray->tfar;
  auVar155._4_4_ = fVar118;
  auVar155._0_4_ = fVar118;
  auVar155._8_4_ = fVar118;
  auVar155._12_4_ = fVar118;
  auVar155._16_4_ = fVar118;
  auVar155._20_4_ = fVar118;
  auVar155._24_4_ = fVar118;
  auVar155._28_4_ = fVar118;
  auVar104 = vminps_avx(auVar104,auVar155);
  auVar135 = vminps_avx(auVar135,auVar104);
  auVar16._4_4_ = auVar135._4_4_ * 1.0000004;
  auVar16._0_4_ = auVar135._0_4_ * 1.0000004;
  auVar16._8_4_ = auVar135._8_4_ * 1.0000004;
  auVar16._12_4_ = auVar135._12_4_ * 1.0000004;
  auVar16._16_4_ = auVar135._16_4_ * 1.0000004;
  auVar16._20_4_ = auVar135._20_4_ * 1.0000004;
  auVar16._24_4_ = auVar135._24_4_ * 1.0000004;
  auVar16._28_4_ = auVar135._28_4_;
  auVar135._1_3_ = 0;
  auVar135[0] = PVar9;
  auVar135[4] = PVar9;
  auVar135._5_3_ = 0;
  auVar135[8] = PVar9;
  auVar135._9_3_ = 0;
  auVar135[0xc] = PVar9;
  auVar135._13_3_ = 0;
  auVar135[0x10] = PVar9;
  auVar135._17_3_ = 0;
  auVar135[0x14] = PVar9;
  auVar135._21_3_ = 0;
  auVar135[0x18] = PVar9;
  auVar135._25_3_ = 0;
  auVar135[0x1c] = PVar9;
  auVar135._29_3_ = 0;
  auVar104 = vpcmpgtd_avx2(auVar135,_DAT_01fe9900);
  auVar135 = vcmpps_avx(local_340,auVar16,2);
  auVar135 = vandps_avx(auVar135,auVar104);
  uVar81 = vmovmskps_avx(auVar135);
  if (uVar81 == 0) {
    return false;
  }
  uVar81 = uVar81 & 0xff;
  auVar104._16_16_ = mm_lookupmask_ps._240_16_;
  auVar104._0_16_ = mm_lookupmask_ps._240_16_;
  local_6c0 = vblendps_avx(auVar104,ZEXT832(0) << 0x20,0x80);
  local_680 = 0x80000000;
  uStack_67c = 0x80000000;
  uStack_678 = 0x80000000;
  uStack_674 = 0x80000000;
  fStack_670 = -0.0;
  fStack_66c = -0.0;
  fStack_668 = -0.0;
  uStack_664 = 0x80000000;
  local_850 = prim;
LAB_0186a71c:
  lVar22 = 0;
  local_848 = (ulong)uVar81;
  for (uVar89 = local_848; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
    lVar22 = lVar22 + 1;
  }
  uVar81 = *(uint *)(local_850 + 2);
  local_8e8 = (ulong)*(uint *)(local_850 + lVar22 * 4 + 6);
  pGVar10 = (context->scene->geometries).items[uVar81].ptr;
  uVar89 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           local_8e8 *
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar118 = (pGVar10->time_range).lower;
  fVar118 = pGVar10->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar118) / ((pGVar10->time_range).upper - fVar118));
  auVar149 = vroundss_avx(ZEXT416((uint)fVar118),ZEXT416((uint)fVar118),9);
  auVar149 = vminss_avx(auVar149,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
  auVar149 = vmaxss_avx(ZEXT816(0) << 0x20,auVar149);
  fVar118 = fVar118 - auVar149._0_4_;
  _Var11 = pGVar10[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar85 = (long)(int)auVar149._0_4_ * 0x38;
  lVar22 = *(long *)(_Var11 + 0x10 + lVar85);
  lVar12 = *(long *)(_Var11 + 0x38 + lVar85);
  lVar13 = *(long *)(_Var11 + 0x48 + lVar85);
  pfVar1 = (float *)(lVar12 + uVar89 * lVar13);
  auVar119._0_4_ = fVar118 * *pfVar1;
  auVar119._4_4_ = fVar118 * pfVar1[1];
  auVar119._8_4_ = fVar118 * pfVar1[2];
  auVar119._12_4_ = fVar118 * pfVar1[3];
  pfVar1 = (float *)(lVar12 + (uVar89 + 1) * lVar13);
  auVar148._0_4_ = fVar118 * *pfVar1;
  auVar148._4_4_ = fVar118 * pfVar1[1];
  auVar148._8_4_ = fVar118 * pfVar1[2];
  auVar148._12_4_ = fVar118 * pfVar1[3];
  pfVar1 = (float *)(lVar12 + (uVar89 + 2) * lVar13);
  auVar194._0_4_ = fVar118 * *pfVar1;
  auVar194._4_4_ = fVar118 * pfVar1[1];
  auVar194._8_4_ = fVar118 * pfVar1[2];
  auVar194._12_4_ = fVar118 * pfVar1[3];
  pfVar1 = (float *)(lVar12 + lVar13 * (uVar89 + 3));
  auVar164._0_4_ = fVar118 * *pfVar1;
  auVar164._4_4_ = fVar118 * pfVar1[1];
  auVar164._8_4_ = fVar118 * pfVar1[2];
  auVar164._12_4_ = fVar118 * pfVar1[3];
  lVar12 = *(long *)(_Var11 + lVar85);
  fVar118 = 1.0 - fVar118;
  auVar94._4_4_ = fVar118;
  auVar94._0_4_ = fVar118;
  auVar94._8_4_ = fVar118;
  auVar94._12_4_ = fVar118;
  auVar213 = vfmadd231ps_fma(auVar119,auVar94,*(undefined1 (*) [16])(lVar12 + lVar22 * uVar89));
  auVar4 = vfmadd231ps_fma(auVar148,auVar94,*(undefined1 (*) [16])(lVar12 + lVar22 * (uVar89 + 1)));
  auVar5 = vfmadd231ps_fma(auVar194,auVar94,*(undefined1 (*) [16])(lVar12 + lVar22 * (uVar89 + 2)));
  auVar6 = vfmadd231ps_fma(auVar164,auVar94,*(undefined1 (*) [16])(lVar12 + lVar22 * (uVar89 + 3)));
  auVar210._0_4_ = (auVar213._0_4_ + auVar4._0_4_ + auVar5._0_4_ + auVar6._0_4_) * 0.25;
  auVar210._4_4_ = (auVar213._4_4_ + auVar4._4_4_ + auVar5._4_4_ + auVar6._4_4_) * 0.25;
  auVar210._8_4_ = (auVar213._8_4_ + auVar4._8_4_ + auVar5._8_4_ + auVar6._8_4_) * 0.25;
  auVar210._12_4_ = (auVar213._12_4_ + auVar4._12_4_ + auVar5._12_4_ + auVar6._12_4_) * 0.25;
  aVar2 = (ray->org).field_0;
  aVar3 = (ray->dir).field_0.field_1;
  auVar149 = vsubps_avx(auVar210,(undefined1  [16])aVar2);
  auVar149 = vdpps_avx(auVar149,(undefined1  [16])aVar3,0x7f);
  auVar100 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar243 = vrcpss_avx(auVar100,auVar100);
  auVar100 = vfnmadd213ss_fma(auVar243,auVar100,ZEXT416(0x40000000));
  fVar118 = auVar149._0_4_ * auVar243._0_4_ * auVar100._0_4_;
  local_860 = ZEXT416((uint)fVar118);
  auVar211._4_4_ = fVar118;
  auVar211._0_4_ = fVar118;
  auVar211._8_4_ = fVar118;
  auVar211._12_4_ = fVar118;
  fStack_890 = fVar118;
  _local_8a0 = auVar211;
  fStack_88c = fVar118;
  fStack_888 = fVar118;
  fStack_884 = fVar118;
  auVar149 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar211);
  auVar149 = vblendps_avx(auVar149,_DAT_01f7aa10,8);
  local_a20 = vsubps_avx(auVar213,auVar149);
  local_a30 = vsubps_avx(auVar5,auVar149);
  local_a40 = vsubps_avx(auVar4,auVar149);
  _local_a50 = vsubps_avx(auVar6,auVar149);
  auVar149 = vmovshdup_avx(local_a20);
  local_1e0 = auVar149._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar149 = vshufps_avx(local_a20,local_a20,0xaa);
  uVar92 = auVar149._0_8_;
  auVar270._8_8_ = uVar92;
  auVar270._0_8_ = uVar92;
  auVar270._16_8_ = uVar92;
  auVar270._24_8_ = uVar92;
  auVar149 = vshufps_avx(local_a20,local_a20,0xff);
  uVar92 = auVar149._0_8_;
  auVar261._8_8_ = uVar92;
  auVar261._0_8_ = uVar92;
  auVar261._16_8_ = uVar92;
  auVar261._24_8_ = uVar92;
  auVar149 = vmovshdup_avx(local_a40);
  local_200 = auVar149._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar149 = vshufps_avx(local_a40,local_a40,0xaa);
  uVar92 = auVar149._0_8_;
  local_a80._8_8_ = uVar92;
  local_a80._0_8_ = uVar92;
  local_a80._16_8_ = uVar92;
  local_a80._24_8_ = uVar92;
  auVar149 = vshufps_avx(local_a40,local_a40,0xff);
  local_220 = auVar149._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar149 = vmovshdup_avx(local_a30);
  uVar92 = auVar149._0_8_;
  local_b00._8_8_ = uVar92;
  local_b00._0_8_ = uVar92;
  local_b00._16_8_ = uVar92;
  local_b00._24_8_ = uVar92;
  auVar149 = vshufps_avx(local_a30,local_a30,0xaa);
  local_3c0 = auVar149._0_4_;
  fStack_3bc = auVar149._4_4_;
  auVar149 = vshufps_avx(local_a30,local_a30,0xff);
  local_3e0 = auVar149._0_4_;
  fStack_3dc = auVar149._4_4_;
  auVar149 = vmovshdup_avx(_local_a50);
  local_240 = auVar149._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar149 = vshufps_avx(_local_a50,_local_a50,0xaa);
  local_260 = auVar149._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar149 = vshufps_avx(_local_a50,_local_a50,0xff);
  local_280 = auVar149._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar95._0_4_ = aVar3.x * aVar3.x;
  auVar95._4_4_ = aVar3.y * aVar3.y;
  auVar95._8_4_ = aVar3.z * aVar3.z;
  auVar95._12_4_ = aVar3.field_3.w * aVar3.field_3.w;
  auVar149 = vshufps_avx(auVar95,auVar95,0xaa);
  uVar91 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_6a0._4_4_ = uVar91;
  local_6a0._0_4_ = uVar91;
  fStack_698 = (float)uVar91;
  fStack_694 = (float)uVar91;
  fStack_690 = (float)uVar91;
  fStack_68c = (float)uVar91;
  fStack_688 = (float)uVar91;
  register0x0000125c = uVar91;
  uVar92 = auVar149._0_8_;
  auVar241._8_8_ = uVar92;
  auVar241._0_8_ = uVar92;
  auVar241._16_8_ = uVar92;
  auVar241._24_8_ = uVar92;
  auVar149 = vfmadd231ps_fma(auVar241,_local_6a0,_local_6a0);
  uVar91 = *(undefined4 *)&(ray->dir).field_0;
  local_520._4_4_ = uVar91;
  local_520._0_4_ = uVar91;
  fStack_518 = (float)uVar91;
  fStack_514 = (float)uVar91;
  fStack_510 = (float)uVar91;
  fStack_50c = (float)uVar91;
  fStack_508 = (float)uVar91;
  register0x0000121c = uVar91;
  auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),_local_520,_local_520);
  auVar242 = ZEXT1664(auVar149);
  local_b44 = 1;
  uVar89 = 0;
  bVar87 = false;
  local_540 = (ray->dir).field_0.m128[2];
  local_2e0._0_4_ = local_a20._0_4_;
  local_2e0._4_4_ = local_2e0._0_4_;
  local_2e0._8_4_ = local_2e0._0_4_;
  local_2e0._12_4_ = local_2e0._0_4_;
  local_2e0._16_4_ = local_2e0._0_4_;
  local_2e0._20_4_ = local_2e0._0_4_;
  local_2e0._24_4_ = local_2e0._0_4_;
  local_2e0._28_4_ = local_2e0._0_4_;
  uVar91 = local_a40._0_4_;
  local_300._4_4_ = uVar91;
  local_300._0_4_ = uVar91;
  local_300._8_4_ = uVar91;
  local_300._12_4_ = uVar91;
  local_300._16_4_ = uVar91;
  local_300._20_4_ = uVar91;
  local_300._24_4_ = uVar91;
  local_300._28_4_ = uVar91;
  uVar91 = local_a30._0_4_;
  local_320._4_4_ = uVar91;
  local_320._0_4_ = uVar91;
  local_320._8_4_ = uVar91;
  local_320._12_4_ = uVar91;
  local_320._16_4_ = uVar91;
  local_320._20_4_ = uVar91;
  local_320._24_4_ = uVar91;
  local_320._28_4_ = uVar91;
  local_2c0 = local_a50._0_4_;
  fStack_2bc = local_2c0;
  fStack_2b8 = local_2c0;
  fStack_2b4 = local_2c0;
  fStack_2b0 = local_2c0;
  fStack_2ac = local_2c0;
  fStack_2a8 = local_2c0;
  fStack_2a4 = local_2c0;
  local_440 = vandps_avx(ZEXT1632(auVar149),local_7e0);
  local_4d0 = ZEXT816(0x3f80000000000000);
  local_2a0 = ZEXT1632(auVar149);
  local_400 = auVar270;
  local_420 = auVar261;
  fStack_53c = local_540;
  fStack_538 = local_540;
  fStack_534 = local_540;
  fStack_530 = local_540;
  fStack_52c = local_540;
  fStack_528 = local_540;
  fStack_524 = local_540;
  fStack_3d8 = local_3e0;
  fStack_3d4 = fStack_3dc;
  fStack_3d0 = local_3e0;
  fStack_3cc = fStack_3dc;
  fStack_3c8 = local_3e0;
  fStack_3c4 = fStack_3dc;
  fStack_3b8 = local_3c0;
  fStack_3b4 = fStack_3bc;
  fStack_3b0 = local_3c0;
  fStack_3ac = fStack_3bc;
  fStack_3a8 = local_3c0;
  fStack_3a4 = fStack_3bc;
  do {
    auVar179._8_4_ = 0x3f800000;
    auVar179._0_8_ = 0x3f8000003f800000;
    auVar179._12_4_ = 0x3f800000;
    auVar179._16_4_ = 0x3f800000;
    auVar179._20_4_ = 0x3f800000;
    iVar88 = (int)uVar89;
    auVar179._24_4_ = 0x3f800000;
    auVar179._28_4_ = 0x3f800000;
    auVar149 = vmovshdup_avx(local_4d0);
    auVar149 = vsubps_avx(auVar149,local_4d0);
    fVar118 = auVar149._0_4_;
    fVar146 = fVar118 * 0.04761905;
    local_760._0_4_ = local_4d0._0_4_;
    local_760._4_4_ = local_760._0_4_;
    local_760._8_4_ = local_760._0_4_;
    local_760._12_4_ = local_760._0_4_;
    local_760._16_4_ = local_760._0_4_;
    local_760._20_4_ = local_760._0_4_;
    local_760._24_4_ = local_760._0_4_;
    local_760._28_4_ = local_760._0_4_;
    local_780._4_4_ = fVar118;
    local_780._0_4_ = fVar118;
    local_780._8_4_ = fVar118;
    local_780._12_4_ = fVar118;
    local_780._16_4_ = fVar118;
    local_780._20_4_ = fVar118;
    local_780._24_4_ = fVar118;
    local_780._28_4_ = fVar118;
    auVar149 = vfmadd231ps_fma(local_760,local_780,_DAT_01faff20);
    auVar135 = vsubps_avx(auVar179,ZEXT1632(auVar149));
    fVar118 = auVar149._0_4_;
    auVar253._0_4_ = local_300._0_4_ * fVar118;
    fVar141 = auVar149._4_4_;
    auVar253._4_4_ = local_300._4_4_ * fVar141;
    fVar142 = auVar149._8_4_;
    auVar253._8_4_ = local_300._8_4_ * fVar142;
    fVar143 = auVar149._12_4_;
    auVar253._12_4_ = local_300._12_4_ * fVar143;
    auVar253._16_4_ = local_300._16_4_ * 0.0;
    auVar253._20_4_ = local_300._20_4_ * 0.0;
    auVar253._28_36_ = auVar252._28_36_;
    auVar253._24_4_ = local_300._24_4_ * 0.0;
    auVar77._8_8_ = uStack_1f8;
    auVar77._0_8_ = local_200;
    auVar77._16_8_ = uStack_1f0;
    auVar77._24_8_ = uStack_1e8;
    auVar246._0_4_ = (float)local_200 * fVar118;
    auVar246._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar141;
    auVar246._8_4_ = (float)uStack_1f8 * fVar142;
    auVar246._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar143;
    auVar246._16_4_ = (float)uStack_1f0 * 0.0;
    auVar246._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar246._28_36_ = auVar245._28_36_;
    auVar246._24_4_ = (float)uStack_1e8 * 0.0;
    auVar139._0_4_ = local_a80._0_4_ * fVar118;
    auVar139._4_4_ = local_a80._4_4_ * fVar141;
    auVar139._8_4_ = local_a80._8_4_ * fVar142;
    auVar139._12_4_ = local_a80._12_4_ * fVar143;
    auVar139._16_4_ = local_a80._16_4_ * 0.0;
    auVar139._20_4_ = local_a80._20_4_ * 0.0;
    auVar139._28_36_ = auVar242._28_36_;
    auVar139._24_4_ = local_a80._24_4_ * 0.0;
    auVar76._8_8_ = uStack_218;
    auVar76._0_8_ = local_220;
    auVar76._16_8_ = uStack_210;
    auVar76._24_8_ = uStack_208;
    auVar23._4_4_ = (float)((ulong)local_220 >> 0x20) * fVar141;
    auVar23._0_4_ = (float)local_220 * fVar118;
    auVar23._8_4_ = (float)uStack_218 * fVar142;
    auVar23._12_4_ = (float)((ulong)uStack_218 >> 0x20) * fVar143;
    auVar23._16_4_ = (float)uStack_210 * 0.0;
    auVar23._20_4_ = (float)((ulong)uStack_210 >> 0x20) * 0.0;
    auVar23._24_4_ = (float)uStack_208 * 0.0;
    auVar23._28_4_ = 0x3f800000;
    auVar149 = vfmadd231ps_fma(auVar253._0_32_,auVar135,local_2e0);
    auVar78._8_8_ = uStack_1d8;
    auVar78._0_8_ = local_1e0;
    auVar78._16_8_ = uStack_1d0;
    auVar78._24_8_ = uStack_1c8;
    auVar100 = vfmadd231ps_fma(auVar246._0_32_,auVar135,auVar78);
    auVar243 = vfmadd231ps_fma(auVar139._0_32_,auVar135,auVar270);
    auVar213 = vfmadd231ps_fma(auVar23,auVar135,auVar261);
    auVar24._4_4_ = local_320._4_4_ * fVar141;
    auVar24._0_4_ = local_320._0_4_ * fVar118;
    auVar24._8_4_ = local_320._8_4_ * fVar142;
    auVar24._12_4_ = local_320._12_4_ * fVar143;
    auVar24._16_4_ = local_320._16_4_ * 0.0;
    auVar24._20_4_ = local_320._20_4_ * 0.0;
    auVar24._24_4_ = local_320._24_4_ * 0.0;
    auVar24._28_4_ = local_2e0._28_4_;
    auVar25._4_4_ = local_b00._4_4_ * fVar141;
    auVar25._0_4_ = local_b00._0_4_ * fVar118;
    auVar25._8_4_ = local_b00._8_4_ * fVar142;
    auVar25._12_4_ = local_b00._12_4_ * fVar143;
    auVar25._16_4_ = local_b00._16_4_ * 0.0;
    auVar25._20_4_ = local_b00._20_4_ * 0.0;
    auVar25._24_4_ = local_b00._24_4_ * 0.0;
    auVar25._28_4_ = local_b00._28_4_;
    auVar79._4_4_ = fVar141 * fStack_3bc;
    auVar79._0_4_ = fVar118 * local_3c0;
    auVar79._8_4_ = fVar142 * fStack_3b8;
    auVar79._12_4_ = fVar143 * fStack_3b4;
    auVar79._16_4_ = fStack_3b0 * 0.0;
    auVar79._20_4_ = fStack_3ac * 0.0;
    auVar79._24_4_ = fStack_3a8 * 0.0;
    auVar79._28_4_ = DAT_01faff20._28_4_;
    auVar26._4_4_ = fVar141 * fStack_3dc;
    auVar26._0_4_ = fVar118 * local_3e0;
    auVar26._8_4_ = fVar142 * fStack_3d8;
    auVar26._12_4_ = fVar143 * fStack_3d4;
    auVar26._16_4_ = fStack_3d0 * 0.0;
    auVar26._20_4_ = fStack_3cc * 0.0;
    uVar91 = (undefined4)((ulong)uStack_1e8 >> 0x20);
    auVar26._24_4_ = fStack_3c8 * 0.0;
    auVar26._28_4_ = uVar91;
    auVar4 = vfmadd231ps_fma(auVar24,auVar135,local_300);
    auVar5 = vfmadd231ps_fma(auVar25,auVar135,auVar77);
    auVar6 = vfmadd231ps_fma(auVar79,auVar135,local_a80);
    auVar7 = vfmadd231ps_fma(auVar26,auVar135,auVar76);
    auVar27._4_4_ = fVar141 * fStack_2bc;
    auVar27._0_4_ = fVar118 * local_2c0;
    auVar27._8_4_ = fVar142 * fStack_2b8;
    auVar27._12_4_ = fVar143 * fStack_2b4;
    auVar27._16_4_ = fStack_2b0 * 0.0;
    auVar27._20_4_ = fStack_2ac * 0.0;
    auVar27._24_4_ = fStack_2a8 * 0.0;
    auVar27._28_4_ = (int)((ulong)uStack_208 >> 0x20);
    auVar28._4_4_ = fVar141 * local_240._4_4_;
    auVar28._0_4_ = fVar118 * (float)local_240;
    auVar28._8_4_ = fVar142 * (float)uStack_238;
    auVar28._12_4_ = fVar143 * uStack_238._4_4_;
    auVar28._16_4_ = (float)uStack_230 * 0.0;
    auVar28._20_4_ = uStack_230._4_4_ * 0.0;
    auVar28._24_4_ = (float)uStack_228 * 0.0;
    auVar28._28_4_ = auVar261._28_4_;
    auVar29._28_4_ = local_a80._28_4_;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(auVar4._12_4_ * fVar143,
                            CONCAT48(auVar4._8_4_ * fVar142,
                                     CONCAT44(auVar4._4_4_ * fVar141,auVar4._0_4_ * fVar118))));
    auVar149 = vfmadd231ps_fma(auVar29,auVar135,ZEXT1632(auVar149));
    auVar100 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar5._12_4_,
                                                  CONCAT48(fVar142 * auVar5._8_4_,
                                                           CONCAT44(fVar141 * auVar5._4_4_,
                                                                    fVar118 * auVar5._0_4_)))),
                               auVar135,ZEXT1632(auVar100));
    auVar243 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar6._12_4_,
                                                  CONCAT48(fVar142 * auVar6._8_4_,
                                                           CONCAT44(fVar141 * auVar6._4_4_,
                                                                    fVar118 * auVar6._0_4_)))),
                               auVar135,ZEXT1632(auVar243));
    auVar213 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar7._12_4_,
                                                  CONCAT48(fVar142 * auVar7._8_4_,
                                                           CONCAT44(fVar141 * auVar7._4_4_,
                                                                    fVar118 * auVar7._0_4_)))),
                               auVar135,ZEXT1632(auVar213));
    auVar30._4_4_ = fVar141 * local_260._4_4_;
    auVar30._0_4_ = fVar118 * (float)local_260;
    auVar30._8_4_ = fVar142 * (float)uStack_258;
    auVar30._12_4_ = fVar143 * uStack_258._4_4_;
    auVar30._16_4_ = (float)uStack_250 * 0.0;
    auVar30._20_4_ = uStack_250._4_4_ * 0.0;
    auVar30._24_4_ = (float)uStack_248 * 0.0;
    auVar30._28_4_ = local_300._28_4_;
    auVar8 = vfmadd231ps_fma(auVar27,auVar135,local_320);
    auVar4 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar8._12_4_ * fVar143,
                                                CONCAT48(auVar8._8_4_ * fVar142,
                                                         CONCAT44(auVar8._4_4_ * fVar141,
                                                                  auVar8._0_4_ * fVar118)))),
                             auVar135,ZEXT1632(auVar4));
    auVar237._0_4_ = fVar118 * (float)local_280;
    auVar237._4_4_ = fVar141 * local_280._4_4_;
    auVar237._8_4_ = fVar142 * (float)uStack_278;
    auVar237._12_4_ = fVar143 * uStack_278._4_4_;
    auVar237._16_4_ = (float)uStack_270 * 0.0;
    auVar237._20_4_ = uStack_270._4_4_ * 0.0;
    auVar237._24_4_ = (float)uStack_268 * 0.0;
    auVar237._28_4_ = 0;
    auVar8 = vfmadd231ps_fma(auVar28,auVar135,local_b00);
    auVar74._4_4_ = fStack_3bc;
    auVar74._0_4_ = local_3c0;
    auVar74._8_4_ = fStack_3b8;
    auVar74._12_4_ = fStack_3b4;
    auVar74._16_4_ = fStack_3b0;
    auVar74._20_4_ = fStack_3ac;
    auVar74._24_4_ = fStack_3a8;
    auVar74._28_4_ = fStack_3a4;
    auVar93 = vfmadd231ps_fma(auVar30,auVar135,auVar74);
    auVar73._4_4_ = fStack_3dc;
    auVar73._0_4_ = local_3e0;
    auVar73._8_4_ = fStack_3d8;
    auVar73._12_4_ = fStack_3d4;
    auVar73._16_4_ = fStack_3d0;
    auVar73._20_4_ = fStack_3cc;
    auVar73._24_4_ = fStack_3c8;
    auVar73._28_4_ = fStack_3c4;
    auVar147 = vfmadd231ps_fma(auVar237,auVar135,auVar73);
    auVar31._28_4_ = local_320._28_4_;
    auVar31._0_28_ =
         ZEXT1628(CONCAT412(auVar147._12_4_ * fVar143,
                            CONCAT48(auVar147._8_4_ * fVar142,
                                     CONCAT44(auVar147._4_4_ * fVar141,auVar147._0_4_ * fVar118))));
    auVar5 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar8._12_4_ * fVar143,
                                                CONCAT48(auVar8._8_4_ * fVar142,
                                                         CONCAT44(auVar8._4_4_ * fVar141,
                                                                  auVar8._0_4_ * fVar118)))),
                             auVar135,ZEXT1632(auVar5));
    auVar6 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar93._12_4_,
                                                CONCAT48(fVar142 * auVar93._8_4_,
                                                         CONCAT44(fVar141 * auVar93._4_4_,
                                                                  fVar118 * auVar93._0_4_)))),
                             auVar135,ZEXT1632(auVar6));
    auVar7 = vfmadd231ps_fma(auVar31,auVar135,ZEXT1632(auVar7));
    auVar32._28_4_ = local_b00._28_4_;
    auVar32._0_28_ =
         ZEXT1628(CONCAT412(auVar4._12_4_ * fVar143,
                            CONCAT48(auVar4._8_4_ * fVar142,
                                     CONCAT44(auVar4._4_4_ * fVar141,auVar4._0_4_ * fVar118))));
    auVar33._28_4_ = uVar91;
    auVar33._0_28_ =
         ZEXT1628(CONCAT412(fVar143 * auVar6._12_4_,
                            CONCAT48(fVar142 * auVar6._8_4_,
                                     CONCAT44(fVar141 * auVar6._4_4_,fVar118 * auVar6._0_4_))));
    auVar8 = vfmadd231ps_fma(auVar32,auVar135,ZEXT1632(auVar149));
    auVar93 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar5._12_4_ * fVar143,
                                                 CONCAT48(auVar5._8_4_ * fVar142,
                                                          CONCAT44(auVar5._4_4_ * fVar141,
                                                                   auVar5._0_4_ * fVar118)))),
                              auVar135,ZEXT1632(auVar100));
    auVar105 = ZEXT1632(auVar93);
    auVar93 = vfmadd231ps_fma(auVar33,auVar135,ZEXT1632(auVar243));
    auVar147 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar7._12_4_ * fVar143,
                                                  CONCAT48(auVar7._8_4_ * fVar142,
                                                           CONCAT44(auVar7._4_4_ * fVar141,
                                                                    auVar7._0_4_ * fVar118)))),
                               ZEXT1632(auVar213),auVar135);
    auVar104 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar149));
    auVar135 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar100));
    auVar157 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar243));
    auVar17 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar213));
    fVar209 = fVar146 * auVar104._0_4_ * 3.0;
    fVar222 = fVar146 * auVar104._4_4_ * 3.0;
    local_720._4_4_ = fVar222;
    local_720._0_4_ = fVar209;
    fVar223 = fVar146 * auVar104._8_4_ * 3.0;
    local_720._8_4_ = fVar223;
    fVar224 = fVar146 * auVar104._12_4_ * 3.0;
    local_720._12_4_ = fVar224;
    fVar225 = fVar146 * auVar104._16_4_ * 3.0;
    local_720._16_4_ = fVar225;
    fVar226 = fVar146 * auVar104._20_4_ * 3.0;
    local_720._20_4_ = fVar226;
    fVar227 = fVar146 * auVar104._24_4_ * 3.0;
    local_720._24_4_ = fVar227;
    local_720._28_4_ = 0x40400000;
    local_980._0_4_ = fVar146 * auVar135._0_4_ * 3.0;
    local_980._4_4_ = fVar146 * auVar135._4_4_ * 3.0;
    local_980._8_4_ = fVar146 * auVar135._8_4_ * 3.0;
    local_980._12_4_ = fVar146 * auVar135._12_4_ * 3.0;
    local_980._16_4_ = fVar146 * auVar135._16_4_ * 3.0;
    local_980._20_4_ = fVar146 * auVar135._20_4_ * 3.0;
    local_980._24_4_ = fVar146 * auVar135._24_4_ * 3.0;
    local_980._28_4_ = 0;
    local_aa0._0_4_ = fVar146 * auVar157._0_4_ * 3.0;
    local_aa0._4_4_ = fVar146 * auVar157._4_4_ * 3.0;
    local_aa0._8_4_ = fVar146 * auVar157._8_4_ * 3.0;
    local_aa0._12_4_ = fVar146 * auVar157._12_4_ * 3.0;
    local_aa0._16_4_ = fVar146 * auVar157._16_4_ * 3.0;
    local_aa0._20_4_ = fVar146 * auVar157._20_4_ * 3.0;
    local_aa0._24_4_ = fVar146 * auVar157._24_4_ * 3.0;
    local_aa0._28_4_ = 0;
    fVar118 = fVar146 * auVar17._0_4_ * 3.0;
    fVar141 = fVar146 * auVar17._4_4_ * 3.0;
    auVar34._4_4_ = fVar141;
    auVar34._0_4_ = fVar118;
    fVar142 = fVar146 * auVar17._8_4_ * 3.0;
    auVar34._8_4_ = fVar142;
    fVar143 = fVar146 * auVar17._12_4_ * 3.0;
    auVar34._12_4_ = fVar143;
    fVar144 = fVar146 * auVar17._16_4_ * 3.0;
    auVar34._16_4_ = fVar144;
    fVar145 = fVar146 * auVar17._20_4_ * 3.0;
    auVar34._20_4_ = fVar145;
    fVar146 = fVar146 * auVar17._24_4_ * 3.0;
    auVar34._24_4_ = fVar146;
    auVar34._28_4_ = auVar104._28_4_;
    local_ae0 = ZEXT1632(auVar8);
    auVar154 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar8));
    auVar155 = vpermps_avx2(_DAT_01fec480,auVar105);
    local_960 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar93));
    auVar186 = vsubps_avx(auVar154,local_ae0);
    auVar18 = vsubps_avx(local_960,ZEXT1632(auVar93));
    fVar189 = auVar18._0_4_;
    fVar190 = auVar18._4_4_;
    auVar35._4_4_ = fVar190 * fVar222;
    auVar35._0_4_ = fVar189 * fVar209;
    fVar209 = auVar18._8_4_;
    auVar35._8_4_ = fVar209 * fVar223;
    fVar222 = auVar18._12_4_;
    auVar35._12_4_ = fVar222 * fVar224;
    fVar223 = auVar18._16_4_;
    auVar35._16_4_ = fVar223 * fVar225;
    fVar224 = auVar18._20_4_;
    auVar35._20_4_ = fVar224 * fVar226;
    fVar225 = auVar18._24_4_;
    auVar35._24_4_ = fVar225 * fVar227;
    auVar35._28_4_ = auVar154._28_4_;
    auVar149 = vfmsub231ps_fma(auVar35,local_aa0,auVar186);
    auVar19 = vsubps_avx(auVar155,auVar105);
    fVar226 = auVar186._0_4_;
    fVar227 = auVar186._4_4_;
    auVar36._4_4_ = fVar227 * local_980._4_4_;
    auVar36._0_4_ = fVar226 * (float)local_980._0_4_;
    fVar191 = auVar186._8_4_;
    auVar36._8_4_ = fVar191 * local_980._8_4_;
    fVar192 = auVar186._12_4_;
    auVar36._12_4_ = fVar192 * local_980._12_4_;
    fVar193 = auVar186._16_4_;
    auVar36._16_4_ = fVar193 * local_980._16_4_;
    fVar247 = auVar186._20_4_;
    auVar36._20_4_ = fVar247 * local_980._20_4_;
    fVar248 = auVar186._24_4_;
    auVar36._24_4_ = fVar248 * local_980._24_4_;
    auVar36._28_4_ = auVar155._28_4_;
    auVar100 = vfmsub231ps_fma(auVar36,local_720,auVar19);
    auVar37._28_4_ = local_960._28_4_;
    auVar37._0_28_ =
         ZEXT1628(CONCAT412(auVar100._12_4_ * auVar100._12_4_,
                            CONCAT48(auVar100._8_4_ * auVar100._8_4_,
                                     CONCAT44(auVar100._4_4_ * auVar100._4_4_,
                                              auVar100._0_4_ * auVar100._0_4_))));
    auVar149 = vfmadd231ps_fma(auVar37,ZEXT1632(auVar149),ZEXT1632(auVar149));
    fVar249 = auVar19._0_4_;
    auVar106._0_4_ = fVar249 * (float)local_aa0._0_4_;
    fVar254 = auVar19._4_4_;
    auVar106._4_4_ = fVar254 * local_aa0._4_4_;
    fVar255 = auVar19._8_4_;
    auVar106._8_4_ = fVar255 * local_aa0._8_4_;
    fVar256 = auVar19._12_4_;
    auVar106._12_4_ = fVar256 * local_aa0._12_4_;
    fVar257 = auVar19._16_4_;
    auVar106._16_4_ = fVar257 * local_aa0._16_4_;
    fVar258 = auVar19._20_4_;
    auVar106._20_4_ = fVar258 * local_aa0._20_4_;
    fVar259 = auVar19._24_4_;
    auVar106._24_4_ = fVar259 * local_aa0._24_4_;
    auVar106._28_4_ = 0;
    auVar243 = vfmsub231ps_fma(auVar106,local_980,auVar18);
    auVar156._0_4_ = fVar189 * fVar189;
    auVar156._4_4_ = fVar190 * fVar190;
    auVar156._8_4_ = fVar209 * fVar209;
    auVar156._12_4_ = fVar222 * fVar222;
    auVar156._16_4_ = fVar223 * fVar223;
    auVar156._20_4_ = fVar224 * fVar224;
    auVar156._24_4_ = fVar225 * fVar225;
    auVar156._28_4_ = 0;
    auVar100 = vfmadd231ps_fma(auVar156,auVar19,auVar19);
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar186,auVar186);
    auVar135 = vrcpps_avx(ZEXT1632(auVar100));
    auVar243 = vfmadd231ps_fma(ZEXT1632(auVar149),ZEXT1632(auVar243),ZEXT1632(auVar243));
    auVar262._8_4_ = 0x3f800000;
    auVar262._0_8_ = 0x3f8000003f800000;
    auVar262._12_4_ = 0x3f800000;
    auVar262._16_4_ = 0x3f800000;
    auVar262._20_4_ = 0x3f800000;
    auVar262._24_4_ = 0x3f800000;
    auVar262._28_4_ = 0x3f800000;
    auVar149 = vfnmadd213ps_fma(auVar135,ZEXT1632(auVar100),auVar262);
    auVar149 = vfmadd132ps_fma(ZEXT1632(auVar149),auVar135,auVar135);
    local_ac0 = vpermps_avx2(_DAT_01fec480,local_720);
    local_8e0 = vpermps_avx2(_DAT_01fec480,local_aa0);
    auVar38._4_4_ = local_ac0._4_4_ * fVar190;
    auVar38._0_4_ = local_ac0._0_4_ * fVar189;
    auVar38._8_4_ = local_ac0._8_4_ * fVar209;
    auVar38._12_4_ = local_ac0._12_4_ * fVar222;
    auVar38._16_4_ = local_ac0._16_4_ * fVar223;
    auVar38._20_4_ = local_ac0._20_4_ * fVar224;
    auVar38._24_4_ = local_ac0._24_4_ * fVar225;
    auVar38._28_4_ = auVar135._28_4_;
    auVar213 = vfmsub231ps_fma(auVar38,local_8e0,auVar186);
    auVar234 = vpermps_avx2(_DAT_01fec480,local_980);
    auVar39._4_4_ = fVar227 * auVar234._4_4_;
    auVar39._0_4_ = fVar226 * auVar234._0_4_;
    auVar39._8_4_ = fVar191 * auVar234._8_4_;
    auVar39._12_4_ = fVar192 * auVar234._12_4_;
    auVar39._16_4_ = fVar193 * auVar234._16_4_;
    auVar39._20_4_ = fVar247 * auVar234._20_4_;
    auVar39._24_4_ = fVar248 * auVar234._24_4_;
    auVar39._28_4_ = 0x40400000;
    auVar4 = vfmsub231ps_fma(auVar39,local_ac0,auVar19);
    auVar213 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar4._12_4_ * auVar4._12_4_,
                                                  CONCAT48(auVar4._8_4_ * auVar4._8_4_,
                                                           CONCAT44(auVar4._4_4_ * auVar4._4_4_,
                                                                    auVar4._0_4_ * auVar4._0_4_)))),
                               ZEXT1632(auVar213),ZEXT1632(auVar213));
    auVar202._0_4_ = fVar249 * local_8e0._0_4_;
    auVar202._4_4_ = fVar254 * local_8e0._4_4_;
    auVar202._8_4_ = fVar255 * local_8e0._8_4_;
    auVar202._12_4_ = fVar256 * local_8e0._12_4_;
    auVar202._16_4_ = fVar257 * local_8e0._16_4_;
    auVar202._20_4_ = fVar258 * local_8e0._20_4_;
    auVar202._24_4_ = fVar259 * local_8e0._24_4_;
    auVar202._28_4_ = 0;
    auVar4 = vfmsub231ps_fma(auVar202,auVar234,auVar18);
    auVar213 = vfmadd231ps_fma(ZEXT1632(auVar213),ZEXT1632(auVar4),ZEXT1632(auVar4));
    auVar135 = vmaxps_avx(ZEXT1632(CONCAT412(auVar243._12_4_ * auVar149._12_4_,
                                             CONCAT48(auVar243._8_4_ * auVar149._8_4_,
                                                      CONCAT44(auVar243._4_4_ * auVar149._4_4_,
                                                               auVar243._0_4_ * auVar149._0_4_)))),
                          ZEXT1632(CONCAT412(auVar213._12_4_ * auVar149._12_4_,
                                             CONCAT48(auVar213._8_4_ * auVar149._8_4_,
                                                      CONCAT44(auVar213._4_4_ * auVar149._4_4_,
                                                               auVar213._0_4_ * auVar149._0_4_)))));
    auVar180._0_4_ = auVar147._0_4_ + fVar118;
    auVar180._4_4_ = auVar147._4_4_ + fVar141;
    auVar180._8_4_ = auVar147._8_4_ + fVar142;
    auVar180._12_4_ = auVar147._12_4_ + fVar143;
    auVar180._16_4_ = fVar144 + 0.0;
    auVar180._20_4_ = fVar145 + 0.0;
    auVar180._24_4_ = fVar146 + 0.0;
    auVar180._28_4_ = auVar104._28_4_ + 0.0;
    auStack_7b0 = auVar180._16_16_;
    local_7a0 = ZEXT1632(auVar147);
    auVar104 = vsubps_avx(local_7a0,auVar34);
    auVar235 = vpermps_avx2(_DAT_01fec480,auVar104);
    auVar236 = vpermps_avx2(_DAT_01fec480,local_7a0);
    auVar104 = vmaxps_avx(local_7a0,auVar180);
    auVar157 = vmaxps_avx(auVar235,auVar236);
    auVar17 = vrsqrtps_avx(ZEXT1632(auVar100));
    auVar104 = vmaxps_avx(auVar104,auVar157);
    fVar118 = auVar17._0_4_;
    fVar141 = auVar17._4_4_;
    fVar142 = auVar17._8_4_;
    fVar143 = auVar17._12_4_;
    fVar146 = auVar17._16_4_;
    fVar144 = auVar17._20_4_;
    fVar145 = auVar17._24_4_;
    auVar40._4_4_ = fVar141 * fVar141 * fVar141 * auVar100._4_4_ * -0.5;
    auVar40._0_4_ = fVar118 * fVar118 * fVar118 * auVar100._0_4_ * -0.5;
    auVar40._8_4_ = fVar142 * fVar142 * fVar142 * auVar100._8_4_ * -0.5;
    auVar40._12_4_ = fVar143 * fVar143 * fVar143 * auVar100._12_4_ * -0.5;
    auVar40._16_4_ = fVar146 * fVar146 * fVar146 * -0.0;
    auVar40._20_4_ = fVar144 * fVar144 * fVar144 * -0.0;
    auVar40._24_4_ = fVar145 * fVar145 * fVar145 * -0.0;
    auVar40._28_4_ = 0;
    auVar107._8_4_ = 0x3fc00000;
    auVar107._0_8_ = 0x3fc000003fc00000;
    auVar107._12_4_ = 0x3fc00000;
    auVar107._16_4_ = 0x3fc00000;
    auVar107._20_4_ = 0x3fc00000;
    auVar107._24_4_ = 0x3fc00000;
    auVar107._28_4_ = 0x3fc00000;
    auVar149 = vfmadd231ps_fma(auVar40,auVar107,auVar17);
    fVar141 = auVar149._0_4_;
    fVar142 = auVar149._4_4_;
    auVar41._4_4_ = fVar254 * fVar142;
    auVar41._0_4_ = fVar249 * fVar141;
    fVar146 = auVar149._8_4_;
    auVar41._8_4_ = fVar255 * fVar146;
    fVar145 = auVar149._12_4_;
    auVar41._12_4_ = fVar256 * fVar145;
    auVar41._16_4_ = fVar257 * 0.0;
    auVar41._20_4_ = fVar258 * 0.0;
    auVar41._24_4_ = fVar259 * 0.0;
    auVar41._28_4_ = 0x3fc00000;
    auVar266._0_4_ = local_540 * fVar189 * fVar141;
    auVar266._4_4_ = fStack_53c * fVar190 * fVar142;
    auVar266._8_4_ = fStack_538 * fVar209 * fVar146;
    auVar266._12_4_ = fStack_534 * fVar222 * fVar145;
    auVar266._16_4_ = fStack_530 * fVar223 * 0.0;
    auVar266._20_4_ = fStack_52c * fVar224 * 0.0;
    auVar266._24_4_ = fStack_528 * fVar225 * 0.0;
    auVar266._28_4_ = 0;
    auVar100 = vfmadd231ps_fma(auVar266,auVar41,_local_6a0);
    auVar260 = ZEXT1632(auVar93);
    local_740 = vsubps_avx(ZEXT832(0) << 0x20,auVar260);
    fVar249 = local_740._0_4_;
    fVar254 = local_740._4_4_;
    auVar42._4_4_ = fVar254 * fVar190 * fVar142;
    auVar42._0_4_ = fVar249 * fVar189 * fVar141;
    fVar189 = local_740._8_4_;
    auVar42._8_4_ = fVar189 * fVar209 * fVar146;
    fVar190 = local_740._12_4_;
    auVar42._12_4_ = fVar190 * fVar222 * fVar145;
    fVar255 = local_740._16_4_;
    auVar42._16_4_ = fVar255 * fVar223 * 0.0;
    fVar256 = local_740._20_4_;
    auVar42._20_4_ = fVar256 * fVar224 * 0.0;
    fVar257 = local_740._24_4_;
    auVar42._24_4_ = fVar257 * fVar225 * 0.0;
    auVar42._28_4_ = auVar18._28_4_;
    auVar17 = vsubps_avx(ZEXT832(0) << 0x20,auVar105);
    auVar243 = vfmadd231ps_fma(auVar42,auVar17,auVar41);
    auVar43._4_4_ = fVar227 * fVar142;
    auVar43._0_4_ = fVar226 * fVar141;
    auVar43._8_4_ = fVar191 * fVar146;
    auVar43._12_4_ = fVar192 * fVar145;
    auVar43._16_4_ = fVar193 * 0.0;
    auVar43._20_4_ = fVar247 * 0.0;
    auVar43._24_4_ = fVar248 * 0.0;
    auVar43._28_4_ = 0x3fc00000;
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar43,_local_520);
    auVar158 = vsubps_avx(ZEXT832(0) << 0x20,local_ae0);
    auVar252 = ZEXT3264(auVar158);
    auVar243 = vfmadd231ps_fma(ZEXT1632(auVar243),auVar158,auVar43);
    auVar44._4_4_ = fStack_53c * fVar254;
    auVar44._0_4_ = local_540 * fVar249;
    auVar44._8_4_ = fStack_538 * fVar189;
    auVar44._12_4_ = fStack_534 * fVar190;
    auVar44._16_4_ = fStack_530 * fVar255;
    auVar44._20_4_ = fStack_52c * fVar256;
    auVar44._24_4_ = fStack_528 * fVar257;
    auVar44._28_4_ = 0x3fc00000;
    auVar213 = vfmadd231ps_fma(auVar44,_local_6a0,auVar17);
    auVar213 = vfmadd231ps_fma(ZEXT1632(auVar213),_local_520,auVar158);
    fVar118 = auVar243._0_4_;
    fVar225 = auVar100._0_4_;
    fVar143 = auVar243._4_4_;
    fVar226 = auVar100._4_4_;
    fVar144 = auVar243._8_4_;
    fVar227 = auVar100._8_4_;
    fVar209 = auVar243._12_4_;
    fVar191 = auVar100._12_4_;
    auVar20 = vsubps_avx(ZEXT1632(auVar213),
                         ZEXT1632(CONCAT412(fVar191 * fVar209,
                                            CONCAT48(fVar227 * fVar144,
                                                     CONCAT44(fVar226 * fVar143,fVar225 * fVar118)))
                                 ));
    auVar45._4_4_ = fVar254 * fVar254;
    auVar45._0_4_ = fVar249 * fVar249;
    auVar45._8_4_ = fVar189 * fVar189;
    auVar45._12_4_ = fVar190 * fVar190;
    auVar45._16_4_ = fVar255 * fVar255;
    auVar45._20_4_ = fVar256 * fVar256;
    auVar45._24_4_ = fVar257 * fVar257;
    auVar45._28_4_ = 0;
    auVar213 = vfmadd231ps_fma(auVar45,auVar17,auVar17);
    auVar213 = vfmadd231ps_fma(ZEXT1632(auVar213),auVar158,auVar158);
    auVar46._28_4_ = local_520._28_4_;
    auVar46._0_28_ =
         ZEXT1628(CONCAT412(fVar209 * fVar209,
                            CONCAT48(fVar144 * fVar144,CONCAT44(fVar143 * fVar143,fVar118 * fVar118)
                                    )));
    auVar15 = vsubps_avx(ZEXT1632(auVar213),auVar46);
    auVar157 = vsqrtps_avx(auVar135);
    fVar118 = (auVar157._0_4_ + auVar104._0_4_) * 1.0000002;
    fVar143 = (auVar157._4_4_ + auVar104._4_4_) * 1.0000002;
    fVar144 = (auVar157._8_4_ + auVar104._8_4_) * 1.0000002;
    fVar209 = (auVar157._12_4_ + auVar104._12_4_) * 1.0000002;
    fVar222 = (auVar157._16_4_ + auVar104._16_4_) * 1.0000002;
    fVar223 = (auVar157._20_4_ + auVar104._20_4_) * 1.0000002;
    fVar224 = (auVar157._24_4_ + auVar104._24_4_) * 1.0000002;
    auVar47._4_4_ = fVar143 * fVar143;
    auVar47._0_4_ = fVar118 * fVar118;
    auVar47._8_4_ = fVar144 * fVar144;
    auVar47._12_4_ = fVar209 * fVar209;
    auVar47._16_4_ = fVar222 * fVar222;
    auVar47._20_4_ = fVar223 * fVar223;
    auVar47._24_4_ = fVar224 * fVar224;
    auVar47._28_4_ = auVar157._28_4_ + auVar104._28_4_;
    local_620._0_4_ = auVar20._0_4_ + auVar20._0_4_;
    local_620._4_4_ = auVar20._4_4_ + auVar20._4_4_;
    fStack_618 = auVar20._8_4_ + auVar20._8_4_;
    fStack_614 = auVar20._12_4_ + auVar20._12_4_;
    fStack_610 = auVar20._16_4_ + auVar20._16_4_;
    fStack_60c = auVar20._20_4_ + auVar20._20_4_;
    fStack_608 = auVar20._24_4_ + auVar20._24_4_;
    fStack_604 = auVar20._28_4_ + auVar20._28_4_;
    auVar242 = ZEXT3264(_local_620);
    auVar104 = vsubps_avx(auVar15,auVar47);
    auVar183 = ZEXT1632(auVar100);
    local_9c0._28_4_ = fStack_524;
    local_9c0._0_28_ =
         ZEXT1628(CONCAT412(fVar191 * fVar191,
                            CONCAT48(fVar227 * fVar227,CONCAT44(fVar226 * fVar226,fVar225 * fVar225)
                                    )));
    auVar20 = vsubps_avx(local_2a0,local_9c0);
    auVar48._4_4_ = (float)local_620._4_4_ * (float)local_620._4_4_;
    auVar48._0_4_ = (float)local_620._0_4_ * (float)local_620._0_4_;
    auVar48._8_4_ = fStack_618 * fStack_618;
    auVar48._12_4_ = fStack_614 * fStack_614;
    auVar48._16_4_ = fStack_610 * fStack_610;
    auVar48._20_4_ = fStack_60c * fStack_60c;
    auVar48._24_4_ = fStack_608 * fStack_608;
    auVar48._28_4_ = 0x3f800002;
    fVar143 = auVar20._0_4_;
    fVar144 = auVar20._4_4_;
    fVar209 = auVar20._8_4_;
    fVar222 = auVar20._12_4_;
    fVar223 = auVar20._16_4_;
    fVar224 = auVar20._20_4_;
    fVar225 = auVar20._24_4_;
    auVar49._4_4_ = fVar144 * 4.0 * auVar104._4_4_;
    auVar49._0_4_ = fVar143 * 4.0 * auVar104._0_4_;
    auVar49._8_4_ = fVar209 * 4.0 * auVar104._8_4_;
    auVar49._12_4_ = fVar222 * 4.0 * auVar104._12_4_;
    auVar49._16_4_ = fVar223 * 4.0 * auVar104._16_4_;
    auVar49._20_4_ = fVar224 * 4.0 * auVar104._20_4_;
    auVar49._24_4_ = fVar225 * 4.0 * auVar104._24_4_;
    auVar49._28_4_ = 0x40800000;
    auVar16 = vsubps_avx(auVar48,auVar49);
    auVar135 = vcmpps_avx(auVar16,ZEXT432(0) << 0x20,5);
    local_9a0 = ZEXT1632(auVar243);
    fVar118 = auVar20._28_4_;
    if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar135 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar135 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar135 >> 0x7f,0) == '\0') &&
          (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar135 >> 0xbf,0) == '\0') &&
        (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar135[0x1f])
    {
      auVar271._8_4_ = 0x7f800000;
      auVar271._0_8_ = 0x7f8000007f800000;
      auVar271._12_4_ = 0x7f800000;
      auVar271._16_4_ = 0x7f800000;
      auVar271._20_4_ = 0x7f800000;
      auVar271._24_4_ = 0x7f800000;
      auVar271._28_4_ = 0x7f800000;
      auVar203._8_4_ = 0xff800000;
      auVar203._0_8_ = 0xff800000ff800000;
      auVar203._12_4_ = 0xff800000;
      auVar203._16_4_ = 0xff800000;
      auVar203._20_4_ = 0xff800000;
      auVar203._24_4_ = 0xff800000;
      auVar203._28_4_ = 0xff800000;
      auVar16 = local_2a0;
    }
    else {
      auVar269 = vsqrtps_avx(auVar16);
      auVar272._0_4_ = fVar143 + fVar143;
      auVar272._4_4_ = fVar144 + fVar144;
      auVar272._8_4_ = fVar209 + fVar209;
      auVar272._12_4_ = fVar222 + fVar222;
      auVar272._16_4_ = fVar223 + fVar223;
      auVar272._20_4_ = fVar224 + fVar224;
      auVar272._24_4_ = fVar225 + fVar225;
      auVar272._28_4_ = fVar118 + fVar118;
      auVar268 = vrcpps_avx(auVar272);
      auVar182 = vcmpps_avx(auVar16,ZEXT432(0) << 0x20,5);
      auVar204._8_4_ = 0x3f800000;
      auVar204._0_8_ = 0x3f8000003f800000;
      auVar204._12_4_ = 0x3f800000;
      auVar204._16_4_ = 0x3f800000;
      auVar204._20_4_ = 0x3f800000;
      auVar204._24_4_ = 0x3f800000;
      auVar204._28_4_ = 0x3f800000;
      auVar243 = vfnmadd213ps_fma(auVar272,auVar268,auVar204);
      auVar243 = vfmadd132ps_fma(ZEXT1632(auVar243),auVar268,auVar268);
      auVar205._0_4_ = local_620._0_4_ ^ local_680;
      auVar205._4_4_ = local_620._4_4_ ^ uStack_67c;
      auVar205._8_4_ = (uint)fStack_618 ^ uStack_678;
      auVar205._12_4_ = (uint)fStack_614 ^ uStack_674;
      auVar205._16_4_ = (uint)fStack_610 ^ (uint)fStack_670;
      auVar205._20_4_ = (uint)fStack_60c ^ (uint)fStack_66c;
      auVar205._24_4_ = (uint)fStack_608 ^ (uint)fStack_668;
      auVar205._28_4_ = (uint)fStack_604 ^ uStack_664;
      auVar261 = vsubps_avx(auVar205,auVar269);
      auVar50._4_4_ = auVar243._4_4_ * auVar261._4_4_;
      auVar50._0_4_ = auVar243._0_4_ * auVar261._0_4_;
      auVar50._8_4_ = auVar243._8_4_ * auVar261._8_4_;
      auVar50._12_4_ = auVar243._12_4_ * auVar261._12_4_;
      auVar50._16_4_ = auVar261._16_4_ * 0.0;
      auVar50._20_4_ = auVar261._20_4_ * 0.0;
      auVar50._24_4_ = auVar261._24_4_ * 0.0;
      auVar50._28_4_ = auVar261._28_4_;
      auVar16 = vsubps_avx(auVar269,_local_620);
      auVar51._4_4_ = auVar243._4_4_ * auVar16._4_4_;
      auVar51._0_4_ = auVar243._0_4_ * auVar16._0_4_;
      auVar51._8_4_ = auVar243._8_4_ * auVar16._8_4_;
      auVar51._12_4_ = auVar243._12_4_ * auVar16._12_4_;
      auVar51._16_4_ = auVar16._16_4_ * 0.0;
      auVar51._20_4_ = auVar16._20_4_ * 0.0;
      auVar51._24_4_ = auVar16._24_4_ * 0.0;
      auVar51._28_4_ = auVar268._28_4_;
      auVar243 = vfmadd213ps_fma(auVar183,auVar50,local_9a0);
      local_360 = ZEXT1632(CONCAT412(fVar145 * auVar243._12_4_,
                                     CONCAT48(fVar146 * auVar243._8_4_,
                                              CONCAT44(fVar142 * auVar243._4_4_,
                                                       fVar141 * auVar243._0_4_))));
      auVar16 = vandps_avx(local_9c0,local_7e0);
      auVar16 = vmaxps_avx(local_440,auVar16);
      auVar52._4_4_ = auVar16._4_4_ * 1.9073486e-06;
      auVar52._0_4_ = auVar16._0_4_ * 1.9073486e-06;
      auVar52._8_4_ = auVar16._8_4_ * 1.9073486e-06;
      auVar52._12_4_ = auVar16._12_4_ * 1.9073486e-06;
      auVar52._16_4_ = auVar16._16_4_ * 1.9073486e-06;
      auVar52._20_4_ = auVar16._20_4_ * 1.9073486e-06;
      auVar52._24_4_ = auVar16._24_4_ * 1.9073486e-06;
      auVar52._28_4_ = auVar16._28_4_;
      auVar16 = vandps_avx(auVar20,local_7e0);
      auVar268 = vcmpps_avx(auVar16,auVar52,1);
      auVar242 = ZEXT3264(auVar183);
      auVar243 = vfmadd213ps_fma(auVar183,auVar51,local_9a0);
      auVar238._8_4_ = 0x7f800000;
      auVar238._0_8_ = 0x7f8000007f800000;
      auVar238._12_4_ = 0x7f800000;
      auVar238._16_4_ = 0x7f800000;
      auVar238._20_4_ = 0x7f800000;
      auVar238._24_4_ = 0x7f800000;
      auVar238._28_4_ = 0x7f800000;
      auVar271 = vblendvps_avx(auVar238,auVar50,auVar182);
      local_380 = auVar243._0_4_ * fVar141;
      fStack_37c = auVar243._4_4_ * fVar142;
      fStack_378 = auVar243._8_4_ * fVar146;
      fStack_374 = auVar243._12_4_ * fVar145;
      uStack_370 = 0;
      uStack_36c = 0;
      uStack_368 = 0;
      uStack_364 = auVar261._28_4_;
      auVar206._8_4_ = 0xff800000;
      auVar206._0_8_ = 0xff800000ff800000;
      auVar206._12_4_ = 0xff800000;
      auVar206._16_4_ = 0xff800000;
      auVar206._20_4_ = 0xff800000;
      auVar206._24_4_ = 0xff800000;
      auVar206._28_4_ = 0xff800000;
      auVar203 = vblendvps_avx(auVar206,auVar51,auVar182);
      auVar183 = auVar182 & auVar268;
      auVar16 = local_7e0;
      if ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar183 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar183 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar183 >> 0x7f,0) != '\0') ||
            (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar183 >> 0xbf,0) != '\0') ||
          (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar183[0x1f] < '\0') {
        auVar135 = vandps_avx(auVar268,auVar182);
        auVar183 = vcmpps_avx(auVar104,ZEXT832(0) << 0x20,2);
        auVar239._8_4_ = 0xff800000;
        auVar239._0_8_ = 0xff800000ff800000;
        auVar239._12_4_ = 0xff800000;
        auVar239._16_4_ = 0xff800000;
        auVar239._20_4_ = 0xff800000;
        auVar239._24_4_ = 0xff800000;
        auVar239._28_4_ = 0xff800000;
        auVar264._8_4_ = 0x7f800000;
        auVar264._0_8_ = 0x7f8000007f800000;
        auVar264._12_4_ = 0x7f800000;
        auVar264._16_4_ = 0x7f800000;
        auVar264._20_4_ = 0x7f800000;
        auVar264._24_4_ = 0x7f800000;
        auVar264._28_4_ = 0x7f800000;
        auVar104 = vblendvps_avx(auVar264,auVar239,auVar183);
        auVar243 = vpackssdw_avx(auVar135._0_16_,auVar135._16_16_);
        auVar268 = vpmovsxwd_avx2(auVar243);
        auVar271 = vblendvps_avx(auVar271,auVar104,auVar268);
        auVar16 = vblendvps_avx(auVar239,auVar264,auVar183);
        auVar203 = vblendvps_avx(auVar203,auVar16,auVar268);
        auVar115._0_8_ = auVar135._0_8_ ^ 0xffffffffffffffff;
        auVar115._8_4_ = auVar135._8_4_ ^ 0xffffffff;
        auVar115._12_4_ = auVar135._12_4_ ^ 0xffffffff;
        auVar115._16_4_ = auVar135._16_4_ ^ 0xffffffff;
        auVar115._20_4_ = auVar135._20_4_ ^ 0xffffffff;
        auVar115._24_4_ = auVar135._24_4_ ^ 0xffffffff;
        auVar115._28_4_ = auVar135._28_4_ ^ 0xffffffff;
        auVar135 = vorps_avx(auVar183,auVar115);
        auVar135 = vandps_avx(auVar182,auVar135);
      }
    }
    local_3a0 = ZEXT1632(auVar100);
    auVar245 = ZEXT3264(auVar16);
    auVar104 = local_6c0 & auVar135;
    if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar104 >> 0x7f,0) != '\0') ||
          (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar104 >> 0xbf,0) != '\0') ||
        (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar104[0x1f] < '\0') {
      fVar226 = (ray->org).field_0.m128[3] - (float)local_860._0_4_;
      auVar108._4_4_ = fVar226;
      auVar108._0_4_ = fVar226;
      auVar108._8_4_ = fVar226;
      auVar108._12_4_ = fVar226;
      auVar108._16_4_ = fVar226;
      auVar108._20_4_ = fVar226;
      auVar108._24_4_ = fVar226;
      auVar108._28_4_ = fVar226;
      auVar16 = vmaxps_avx(auVar108,auVar271);
      fVar226 = ray->tfar - (float)local_860._0_4_;
      auVar217._4_4_ = fVar226;
      auVar217._0_4_ = fVar226;
      auVar217._8_4_ = fVar226;
      auVar217._12_4_ = fVar226;
      auVar217._16_4_ = fVar226;
      auVar217._20_4_ = fVar226;
      auVar217._24_4_ = fVar226;
      auVar217._28_4_ = fVar226;
      auVar183 = vminps_avx(auVar217,auVar203);
      auVar242._0_4_ = (float)local_aa0._0_4_ * fVar249;
      auVar242._4_4_ = local_aa0._4_4_ * fVar254;
      auVar242._8_4_ = local_aa0._8_4_ * fVar189;
      auVar242._12_4_ = local_aa0._12_4_ * fVar190;
      auVar242._16_4_ = local_aa0._16_4_ * fVar255;
      auVar242._20_4_ = local_aa0._20_4_ * fVar256;
      auVar242._28_36_ = SUB4836((undefined1  [48])0x0,0xc);
      auVar242._24_4_ = local_aa0._24_4_ * fVar257;
      auVar100 = vfmadd213ps_fma(auVar17,local_980,auVar242._0_32_);
      auVar243 = vfmadd213ps_fma(auVar158,local_720,ZEXT1632(auVar100));
      auVar181._0_4_ = local_540 * (float)local_aa0._0_4_;
      auVar181._4_4_ = fStack_53c * local_aa0._4_4_;
      auVar181._8_4_ = fStack_538 * local_aa0._8_4_;
      auVar181._12_4_ = fStack_534 * local_aa0._12_4_;
      auVar181._16_4_ = fStack_530 * local_aa0._16_4_;
      auVar181._20_4_ = fStack_52c * local_aa0._20_4_;
      auVar181._24_4_ = fStack_528 * local_aa0._24_4_;
      auVar181._28_4_ = 0;
      auVar100 = vfmadd231ps_fma(auVar181,_local_6a0,local_980);
      auVar242 = ZEXT3264(_local_520);
      auVar213 = vfmadd231ps_fma(ZEXT1632(auVar100),_local_520,local_720);
      auVar104 = vandps_avx(local_7e0,ZEXT1632(auVar213));
      auVar263._8_4_ = 0x219392ef;
      auVar263._0_8_ = 0x219392ef219392ef;
      auVar263._12_4_ = 0x219392ef;
      auVar263._16_4_ = 0x219392ef;
      auVar263._20_4_ = 0x219392ef;
      auVar263._24_4_ = 0x219392ef;
      auVar263._28_4_ = 0x219392ef;
      auVar17 = vcmpps_avx(auVar104,auVar263,1);
      auVar104 = vrcpps_avx(ZEXT1632(auVar213));
      auVar267._8_4_ = 0x3f800000;
      auVar267._0_8_ = 0x3f8000003f800000;
      auVar267._12_4_ = 0x3f800000;
      auVar267._16_4_ = 0x3f800000;
      auVar267._20_4_ = 0x3f800000;
      auVar267._24_4_ = 0x3f800000;
      auVar267._28_4_ = 0x3f800000;
      auVar182 = ZEXT1632(auVar213);
      auVar100 = vfnmadd213ps_fma(auVar104,auVar182,auVar267);
      auVar100 = vfmadd132ps_fma(ZEXT1632(auVar100),auVar104,auVar104);
      auVar250._0_4_ = local_680 ^ auVar213._0_4_;
      auVar250._4_4_ = uStack_67c ^ auVar213._4_4_;
      auVar250._8_4_ = uStack_678 ^ auVar213._8_4_;
      auVar250._12_4_ = uStack_674 ^ auVar213._12_4_;
      auVar250._16_4_ = fStack_670;
      auVar250._20_4_ = fStack_66c;
      auVar250._24_4_ = fStack_668;
      auVar250._28_4_ = uStack_664;
      auVar53._4_4_ = auVar100._4_4_ * (float)(auVar243._4_4_ ^ uStack_67c);
      auVar53._0_4_ = auVar100._0_4_ * (float)(auVar243._0_4_ ^ local_680);
      auVar53._8_4_ = auVar100._8_4_ * (float)(auVar243._8_4_ ^ uStack_678);
      auVar53._12_4_ = auVar100._12_4_ * (float)(auVar243._12_4_ ^ uStack_674);
      auVar53._16_4_ = fStack_670 * 0.0;
      auVar53._20_4_ = fStack_66c * 0.0;
      auVar53._24_4_ = fStack_668 * 0.0;
      auVar53._28_4_ = uStack_664;
      auVar104 = vcmpps_avx(auVar182,auVar250,1);
      auVar104 = vorps_avx(auVar17,auVar104);
      auVar273._8_4_ = 0xff800000;
      auVar273._0_8_ = 0xff800000ff800000;
      auVar273._12_4_ = 0xff800000;
      auVar273._16_4_ = 0xff800000;
      auVar273._20_4_ = 0xff800000;
      auVar273._24_4_ = 0xff800000;
      auVar273._28_4_ = 0xff800000;
      auVar104 = vblendvps_avx(auVar53,auVar273,auVar104);
      auVar158 = vmaxps_avx(auVar16,auVar104);
      auVar104 = vcmpps_avx(auVar182,auVar250,6);
      auVar104 = vorps_avx(auVar17,auVar104);
      auVar251._8_4_ = 0x7f800000;
      auVar251._0_8_ = 0x7f8000007f800000;
      auVar251._12_4_ = 0x7f800000;
      auVar251._16_4_ = 0x7f800000;
      auVar251._20_4_ = 0x7f800000;
      auVar251._24_4_ = 0x7f800000;
      auVar251._28_4_ = 0x7f800000;
      auVar252 = ZEXT3264(auVar251);
      auVar104 = vblendvps_avx(auVar53,auVar251,auVar104);
      auVar16 = vminps_avx(auVar183,auVar104);
      fVar226 = (float)(local_680 ^ (uint)local_8e0._0_4_);
      fVar227 = (float)(uStack_67c ^ (uint)local_8e0._4_4_);
      fVar189 = (float)(uStack_678 ^ (uint)local_8e0._8_4_);
      fVar190 = (float)(uStack_674 ^ (uint)local_8e0._12_4_);
      fVar191 = (float)((uint)fStack_670 ^ (uint)local_8e0._16_4_);
      fVar192 = (float)((uint)fStack_66c ^ (uint)local_8e0._20_4_);
      fVar193 = (float)((uint)fStack_668 ^ (uint)local_8e0._24_4_);
      auStack_870._12_4_ = auVar234._28_4_;
      auVar207._0_4_ = local_680 ^ (uint)auVar234._0_4_;
      auVar207._4_4_ = uStack_67c ^ (uint)auVar234._4_4_;
      auVar207._8_4_ = uStack_678 ^ (uint)auVar234._8_4_;
      auVar207._12_4_ = uStack_674 ^ (uint)auVar234._12_4_;
      auVar207._16_4_ = (uint)fStack_670 ^ (uint)auVar234._16_4_;
      auVar207._20_4_ = (uint)fStack_66c ^ (uint)auVar234._20_4_;
      auVar207._24_4_ = (uint)fStack_668 ^ (uint)auVar234._24_4_;
      auVar207._28_4_ = uStack_664 ^ auStack_870._12_4_;
      auVar104 = vsubps_avx(ZEXT832(0) << 0x20,auVar155);
      auVar17 = vsubps_avx(ZEXT832(0) << 0x20,local_960);
      auVar54._4_4_ = auVar17._4_4_ * fVar227;
      auVar54._0_4_ = auVar17._0_4_ * fVar226;
      auVar54._8_4_ = auVar17._8_4_ * fVar189;
      auVar54._12_4_ = auVar17._12_4_ * fVar190;
      auVar54._16_4_ = auVar17._16_4_ * fVar191;
      auVar54._20_4_ = auVar17._20_4_ * fVar192;
      auVar54._24_4_ = auVar17._24_4_ * fVar193;
      auVar54._28_4_ = auVar17._28_4_;
      auVar100 = vfmadd231ps_fma(auVar54,auVar207,auVar104);
      auVar218._0_4_ = local_680 ^ (uint)local_ac0._0_4_;
      auVar218._4_4_ = uStack_67c ^ (uint)local_ac0._4_4_;
      auVar218._8_4_ = uStack_678 ^ (uint)local_ac0._8_4_;
      auVar218._12_4_ = uStack_674 ^ (uint)local_ac0._12_4_;
      auVar218._16_4_ = (uint)fStack_670 ^ (uint)local_ac0._16_4_;
      auVar218._20_4_ = (uint)fStack_66c ^ (uint)local_ac0._20_4_;
      auVar218._24_4_ = (uint)fStack_668 ^ (uint)local_ac0._24_4_;
      auVar218._28_4_ = uStack_664 ^ local_ac0._28_4_;
      auVar104 = vsubps_avx(ZEXT832(0) << 0x20,auVar154);
      auVar243 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar218,auVar104);
      auVar55._4_4_ = fStack_53c * fVar227;
      auVar55._0_4_ = local_540 * fVar226;
      auVar55._8_4_ = fStack_538 * fVar189;
      auVar55._12_4_ = fStack_534 * fVar190;
      auVar55._16_4_ = fStack_530 * fVar191;
      auVar55._20_4_ = fStack_52c * fVar192;
      auVar55._24_4_ = fStack_528 * fVar193;
      auVar55._28_4_ = uStack_664 ^ local_8e0._28_4_;
      auVar100 = vfmadd231ps_fma(auVar55,_local_6a0,auVar207);
      auVar213 = vfmadd231ps_fma(ZEXT1632(auVar100),_local_520,auVar218);
      auVar104 = vandps_avx(local_7e0,ZEXT1632(auVar213));
      auVar154 = vrcpps_avx(ZEXT1632(auVar213));
      auVar244._8_4_ = 0x219392ef;
      auVar244._0_8_ = 0x219392ef219392ef;
      auVar244._12_4_ = 0x219392ef;
      auVar244._16_4_ = 0x219392ef;
      auVar244._20_4_ = 0x219392ef;
      auVar244._24_4_ = 0x219392ef;
      auVar244._28_4_ = 0x219392ef;
      auVar17 = vcmpps_avx(auVar104,auVar244,1);
      auVar183 = ZEXT1632(auVar213);
      auVar100 = vfnmadd213ps_fma(auVar154,auVar183,auVar267);
      auVar100 = vfmadd132ps_fma(ZEXT1632(auVar100),auVar154,auVar154);
      auVar219._0_4_ = local_680 ^ auVar213._0_4_;
      auVar219._4_4_ = uStack_67c ^ auVar213._4_4_;
      auVar219._8_4_ = uStack_678 ^ auVar213._8_4_;
      auVar219._12_4_ = uStack_674 ^ auVar213._12_4_;
      auVar219._16_4_ = fStack_670;
      auVar219._20_4_ = fStack_66c;
      auVar219._24_4_ = fStack_668;
      auVar219._28_4_ = uStack_664;
      auVar56._4_4_ = auVar100._4_4_ * (float)(uStack_67c ^ auVar243._4_4_);
      auVar56._0_4_ = auVar100._0_4_ * (float)(local_680 ^ auVar243._0_4_);
      auVar56._8_4_ = auVar100._8_4_ * (float)(uStack_678 ^ auVar243._8_4_);
      auVar56._12_4_ = auVar100._12_4_ * (float)(uStack_674 ^ auVar243._12_4_);
      auVar56._16_4_ = fStack_670 * 0.0;
      auVar56._20_4_ = fStack_66c * 0.0;
      auVar56._24_4_ = fStack_668 * 0.0;
      auVar56._28_4_ = uStack_664;
      auVar104 = vcmpps_avx(auVar183,auVar219,1);
      auVar104 = vorps_avx(auVar104,auVar17);
      auVar104 = vblendvps_avx(auVar56,auVar273,auVar104);
      auVar245 = ZEXT3264(auVar104);
      _local_660 = vmaxps_avx(auVar158,auVar104);
      auVar104 = vcmpps_avx(auVar183,auVar219,6);
      auVar104 = vorps_avx(auVar17,auVar104);
      auVar104 = vblendvps_avx(auVar56,auVar251,auVar104);
      auVar135 = vandps_avx(local_6c0,auVar135);
      local_4a0 = vminps_avx(auVar16,auVar104);
      auVar104 = vcmpps_avx(_local_660,local_4a0,2);
      auVar17 = auVar135 & auVar104;
      if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar17 >> 0x7f,0) != '\0') ||
            (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0xbf,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar17[0x1f] < '\0') {
        auVar220._8_4_ = 0x3f800000;
        auVar220._0_8_ = 0x3f8000003f800000;
        auVar220._12_4_ = 0x3f800000;
        auVar220._16_4_ = 0x3f800000;
        auVar220._20_4_ = 0x3f800000;
        auVar220._24_4_ = 0x3f800000;
        auVar220._28_4_ = 0x3f800000;
        auVar17 = vminps_avx(local_360,auVar220);
        auVar17 = vmaxps_avx(auVar17,ZEXT832(0) << 0x20);
        auVar75._4_4_ = fStack_37c;
        auVar75._0_4_ = local_380;
        auVar75._8_4_ = fStack_378;
        auVar75._12_4_ = fStack_374;
        auVar75._16_4_ = uStack_370;
        auVar75._20_4_ = uStack_36c;
        auVar75._24_4_ = uStack_368;
        auVar75._28_4_ = uStack_364;
        auVar158 = vminps_avx(auVar75,auVar220);
        auVar158 = vmaxps_avx(auVar158,ZEXT832(0) << 0x20);
        auVar57._4_4_ = (auVar17._4_4_ + 1.0) * 0.125;
        auVar57._0_4_ = (auVar17._0_4_ + 0.0) * 0.125;
        auVar57._8_4_ = (auVar17._8_4_ + 2.0) * 0.125;
        auVar57._12_4_ = (auVar17._12_4_ + 3.0) * 0.125;
        auVar57._16_4_ = (auVar17._16_4_ + 4.0) * 0.125;
        auVar57._20_4_ = (auVar17._20_4_ + 5.0) * 0.125;
        auVar57._24_4_ = (auVar17._24_4_ + 6.0) * 0.125;
        auVar57._28_4_ = auVar17._28_4_ + 7.0;
        auVar100 = vfmadd213ps_fma(auVar57,local_780,local_760);
        auVar58._4_4_ = (auVar158._4_4_ + 1.0) * 0.125;
        auVar58._0_4_ = (auVar158._0_4_ + 0.0) * 0.125;
        auVar58._8_4_ = (auVar158._8_4_ + 2.0) * 0.125;
        auVar58._12_4_ = (auVar158._12_4_ + 3.0) * 0.125;
        auVar58._16_4_ = (auVar158._16_4_ + 4.0) * 0.125;
        auVar58._20_4_ = (auVar158._20_4_ + 5.0) * 0.125;
        auVar58._24_4_ = (auVar158._24_4_ + 6.0) * 0.125;
        auVar58._28_4_ = auVar158._28_4_ + 7.0;
        auVar243 = vfmadd213ps_fma(auVar58,local_780,local_760);
        auVar17 = vminps_avx(local_7a0,auVar180);
        auVar158 = vminps_avx(auVar235,auVar236);
        auVar17 = vminps_avx(auVar17,auVar158);
        auVar157 = vsubps_avx(auVar17,auVar157);
        local_940 = vandps_avx(auVar104,auVar135);
        local_1a0 = ZEXT1632(auVar100);
        local_1c0 = ZEXT1632(auVar243);
        auVar59._4_4_ = auVar157._4_4_ * 0.99999976;
        auVar59._0_4_ = auVar157._0_4_ * 0.99999976;
        auVar59._8_4_ = auVar157._8_4_ * 0.99999976;
        auVar59._12_4_ = auVar157._12_4_ * 0.99999976;
        auVar59._16_4_ = auVar157._16_4_ * 0.99999976;
        auVar59._20_4_ = auVar157._20_4_ * 0.99999976;
        auVar59._24_4_ = auVar157._24_4_ * 0.99999976;
        auVar59._28_4_ = 0x3f7ffffc;
        auVar135 = vmaxps_avx(ZEXT832(0) << 0x20,auVar59);
        auVar60._4_4_ = auVar135._4_4_ * auVar135._4_4_;
        auVar60._0_4_ = auVar135._0_4_ * auVar135._0_4_;
        auVar60._8_4_ = auVar135._8_4_ * auVar135._8_4_;
        auVar60._12_4_ = auVar135._12_4_ * auVar135._12_4_;
        auVar60._16_4_ = auVar135._16_4_ * auVar135._16_4_;
        auVar60._20_4_ = auVar135._20_4_ * auVar135._20_4_;
        auVar60._24_4_ = auVar135._24_4_ * auVar135._24_4_;
        auVar60._28_4_ = auVar135._28_4_;
        auVar104 = vsubps_avx(auVar15,auVar60);
        auVar245 = ZEXT3264(auVar104);
        auVar61._4_4_ = auVar104._4_4_ * fVar144 * 4.0;
        auVar61._0_4_ = auVar104._0_4_ * fVar143 * 4.0;
        auVar61._8_4_ = auVar104._8_4_ * fVar209 * 4.0;
        auVar61._12_4_ = auVar104._12_4_ * fVar222 * 4.0;
        auVar61._16_4_ = auVar104._16_4_ * fVar223 * 4.0;
        auVar61._20_4_ = auVar104._20_4_ * fVar224 * 4.0;
        auVar61._24_4_ = auVar104._24_4_ * fVar225 * 4.0;
        auVar61._28_4_ = auVar135._28_4_;
        auVar17 = vsubps_avx(auVar48,auVar61);
        auVar71 = ZEXT412(0);
        auVar158 = ZEXT1232(auVar71) << 0x20;
        local_820 = ZEXT1232(auVar71) << 0x20;
        _local_8c0 = vcmpps_avx(auVar17,ZEXT832(0) << 0x20,5);
        auVar135 = _local_8c0;
        if ((((((((_local_8c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (_local_8c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (_local_8c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(_local_8c0 >> 0x7f,0) == '\0') &&
              (_local_8c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(_local_8c0 >> 0xbf,0) == '\0') &&
            (_local_8c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_8c0[0x1f]) {
          _local_840 = ZEXT1232(auVar71) << 0x20;
          auVar186 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar201 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar221._8_4_ = 0x7f800000;
          auVar221._0_8_ = 0x7f8000007f800000;
          auVar221._12_4_ = 0x7f800000;
          auVar221._16_4_ = 0x7f800000;
          auVar221._20_4_ = 0x7f800000;
          auVar221._24_4_ = 0x7f800000;
          auVar221._28_4_ = 0x7f800000;
          auVar230._8_4_ = 0xff800000;
          auVar230._0_8_ = 0xff800000ff800000;
          auVar230._12_4_ = 0xff800000;
          auVar230._16_4_ = 0xff800000;
          auVar230._20_4_ = 0xff800000;
          auVar230._24_4_ = 0xff800000;
          auVar230._28_4_ = 0xff800000;
          _local_8c0 = auVar155;
          _local_800 = local_820;
        }
        else {
          auVar15 = vsqrtps_avx(auVar17);
          auVar184._0_4_ = fVar143 + fVar143;
          auVar184._4_4_ = fVar144 + fVar144;
          auVar184._8_4_ = fVar209 + fVar209;
          auVar184._12_4_ = fVar222 + fVar222;
          auVar184._16_4_ = fVar223 + fVar223;
          auVar184._20_4_ = fVar224 + fVar224;
          auVar184._24_4_ = fVar225 + fVar225;
          auVar184._28_4_ = fVar118 + fVar118;
          auVar158 = vrcpps_avx(auVar184);
          auVar132._8_4_ = 0x3f800000;
          auVar132._0_8_ = 0x3f8000003f800000;
          auVar132._12_4_ = 0x3f800000;
          auVar132._16_4_ = 0x3f800000;
          auVar132._20_4_ = 0x3f800000;
          auVar132._24_4_ = 0x3f800000;
          auVar132._28_4_ = 0x3f800000;
          auVar100 = vfnmadd213ps_fma(auVar184,auVar158,auVar132);
          auVar100 = vfmadd132ps_fma(ZEXT1632(auVar100),auVar158,auVar158);
          auVar208._0_4_ = local_620._0_4_ ^ local_680;
          auVar208._4_4_ = local_620._4_4_ ^ uStack_67c;
          auVar208._8_4_ = (uint)fStack_618 ^ uStack_678;
          auVar208._12_4_ = (uint)fStack_614 ^ uStack_674;
          auVar208._16_4_ = (uint)fStack_610 ^ (uint)fStack_670;
          auVar208._20_4_ = (uint)fStack_60c ^ (uint)fStack_66c;
          auVar208._24_4_ = (uint)fStack_608 ^ (uint)fStack_668;
          auVar208._28_4_ = (uint)fStack_604 ^ uStack_664;
          auVar158 = vsubps_avx(auVar208,auVar15);
          auVar15 = vsubps_avx(auVar15,_local_620);
          fVar118 = auVar158._0_4_ * auVar100._0_4_;
          fVar143 = auVar158._4_4_ * auVar100._4_4_;
          auVar62._4_4_ = fVar143;
          auVar62._0_4_ = fVar118;
          fVar144 = auVar158._8_4_ * auVar100._8_4_;
          auVar62._8_4_ = fVar144;
          fVar209 = auVar158._12_4_ * auVar100._12_4_;
          auVar62._12_4_ = fVar209;
          fVar222 = auVar158._16_4_ * 0.0;
          auVar62._16_4_ = fVar222;
          fVar223 = auVar158._20_4_ * 0.0;
          auVar62._20_4_ = fVar223;
          fVar224 = auVar158._24_4_ * 0.0;
          auVar62._24_4_ = fVar224;
          auVar62._28_4_ = auVar157._28_4_;
          fVar225 = auVar15._0_4_ * auVar100._0_4_;
          fVar226 = auVar15._4_4_ * auVar100._4_4_;
          auVar63._4_4_ = fVar226;
          auVar63._0_4_ = fVar225;
          fVar227 = auVar15._8_4_ * auVar100._8_4_;
          auVar63._8_4_ = fVar227;
          fVar189 = auVar15._12_4_ * auVar100._12_4_;
          auVar63._12_4_ = fVar189;
          fVar190 = auVar15._16_4_ * 0.0;
          auVar63._16_4_ = fVar190;
          fVar191 = auVar15._20_4_ * 0.0;
          auVar63._20_4_ = fVar191;
          fVar192 = auVar15._24_4_ * 0.0;
          auVar63._24_4_ = fVar192;
          auVar63._28_4_ = local_6c0._28_4_;
          auVar100 = vfmadd213ps_fma(local_3a0,auVar62,local_9a0);
          auVar243 = vfmadd213ps_fma(local_3a0,auVar63,local_9a0);
          auVar64._28_4_ = auVar158._28_4_;
          auVar64._0_28_ =
               ZEXT1628(CONCAT412(fVar145 * auVar100._12_4_,
                                  CONCAT48(fVar146 * auVar100._8_4_,
                                           CONCAT44(fVar142 * auVar100._4_4_,
                                                    fVar141 * auVar100._0_4_))));
          auVar157 = ZEXT1632(CONCAT412(fVar145 * auVar243._12_4_,
                                        CONCAT48(fVar146 * auVar243._8_4_,
                                                 CONCAT44(fVar142 * auVar243._4_4_,
                                                          fVar141 * auVar243._0_4_))));
          auVar100 = vfmadd213ps_fma(auVar186,auVar64,local_ae0);
          auVar243 = vfmadd213ps_fma(auVar186,auVar157,local_ae0);
          auVar213 = vfmadd213ps_fma(auVar19,auVar64,auVar105);
          auVar4 = vfmadd213ps_fma(auVar19,auVar157,auVar105);
          auVar5 = vfmadd213ps_fma(auVar64,auVar18,auVar260);
          auVar6 = vfmadd213ps_fma(auVar18,auVar157,auVar260);
          auVar65._4_4_ = (float)local_520._4_4_ * fVar143;
          auVar65._0_4_ = (float)local_520._0_4_ * fVar118;
          auVar65._8_4_ = fStack_518 * fVar144;
          auVar65._12_4_ = fStack_514 * fVar209;
          auVar65._16_4_ = fStack_510 * fVar222;
          auVar65._20_4_ = fStack_50c * fVar223;
          auVar65._24_4_ = fStack_508 * fVar224;
          auVar65._28_4_ = 0;
          auVar158 = vsubps_avx(auVar65,ZEXT1632(auVar100));
          auVar185._0_4_ = (float)local_6a0._0_4_ * fVar118;
          auVar185._4_4_ = (float)local_6a0._4_4_ * fVar143;
          auVar185._8_4_ = fStack_698 * fVar144;
          auVar185._12_4_ = fStack_694 * fVar209;
          auVar185._16_4_ = fStack_690 * fVar222;
          auVar185._20_4_ = fStack_68c * fVar223;
          auVar185._24_4_ = fStack_688 * fVar224;
          auVar185._28_4_ = 0;
          auVar186 = vsubps_avx(auVar185,ZEXT1632(auVar213));
          auVar231._0_4_ = local_540 * fVar118;
          auVar231._4_4_ = fStack_53c * fVar143;
          auVar231._8_4_ = fStack_538 * fVar144;
          auVar231._12_4_ = fStack_534 * fVar209;
          auVar231._16_4_ = fStack_530 * fVar222;
          auVar231._20_4_ = fStack_52c * fVar223;
          auVar231._24_4_ = fStack_528 * fVar224;
          auVar231._28_4_ = 0;
          auVar157 = vsubps_avx(auVar231,ZEXT1632(auVar5));
          auVar201 = auVar157._0_28_;
          auVar66._4_4_ = (float)local_520._4_4_ * fVar226;
          auVar66._0_4_ = (float)local_520._0_4_ * fVar225;
          auVar66._8_4_ = fStack_518 * fVar227;
          auVar66._12_4_ = fStack_514 * fVar189;
          auVar66._16_4_ = fStack_510 * fVar190;
          auVar66._20_4_ = fStack_50c * fVar191;
          auVar66._24_4_ = fStack_508 * fVar192;
          auVar66._28_4_ = 0;
          _local_800 = vsubps_avx(auVar66,ZEXT1632(auVar243));
          auVar67._4_4_ = fVar226 * (float)local_6a0._4_4_;
          auVar67._0_4_ = fVar225 * (float)local_6a0._0_4_;
          auVar67._8_4_ = fVar227 * fStack_698;
          auVar67._12_4_ = fVar189 * fStack_694;
          auVar67._16_4_ = fVar190 * fStack_690;
          auVar67._20_4_ = fVar191 * fStack_68c;
          auVar67._24_4_ = fVar192 * fStack_688;
          auVar67._28_4_ = local_800._28_4_;
          local_820 = vsubps_avx(auVar67,ZEXT1632(auVar4));
          auVar68._4_4_ = fStack_53c * fVar226;
          auVar68._0_4_ = local_540 * fVar225;
          auVar68._8_4_ = fStack_538 * fVar227;
          auVar68._12_4_ = fStack_534 * fVar189;
          auVar68._16_4_ = fStack_530 * fVar190;
          auVar68._20_4_ = fStack_52c * fVar191;
          auVar68._24_4_ = fStack_528 * fVar192;
          auVar68._28_4_ = local_820._28_4_;
          _local_840 = vsubps_avx(auVar68,ZEXT1632(auVar6));
          auVar17 = vcmpps_avx(auVar17,_DAT_01faff00,5);
          auVar232._8_4_ = 0x7f800000;
          auVar232._0_8_ = 0x7f8000007f800000;
          auVar232._12_4_ = 0x7f800000;
          auVar232._16_4_ = 0x7f800000;
          auVar232._20_4_ = 0x7f800000;
          auVar232._24_4_ = 0x7f800000;
          auVar232._28_4_ = 0x7f800000;
          auVar221 = vblendvps_avx(auVar232,auVar62,auVar17);
          auVar157 = vandps_avx(local_7e0,local_9c0);
          auVar157 = vmaxps_avx(local_440,auVar157);
          auVar69._4_4_ = auVar157._4_4_ * 1.9073486e-06;
          auVar69._0_4_ = auVar157._0_4_ * 1.9073486e-06;
          auVar69._8_4_ = auVar157._8_4_ * 1.9073486e-06;
          auVar69._12_4_ = auVar157._12_4_ * 1.9073486e-06;
          auVar69._16_4_ = auVar157._16_4_ * 1.9073486e-06;
          auVar69._20_4_ = auVar157._20_4_ * 1.9073486e-06;
          auVar69._24_4_ = auVar157._24_4_ * 1.9073486e-06;
          auVar69._28_4_ = auVar157._28_4_;
          auVar157 = vandps_avx(auVar20,local_7e0);
          auVar157 = vcmpps_avx(auVar157,auVar69,1);
          auVar233._8_4_ = 0xff800000;
          auVar233._0_8_ = 0xff800000ff800000;
          auVar233._12_4_ = 0xff800000;
          auVar233._16_4_ = 0xff800000;
          auVar233._20_4_ = 0xff800000;
          auVar233._24_4_ = 0xff800000;
          auVar233._28_4_ = 0xff800000;
          auVar230 = vblendvps_avx(auVar233,auVar63,auVar17);
          auVar18 = auVar17 & auVar157;
          if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar18 >> 0x7f,0) != '\0') ||
                (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar18 >> 0xbf,0) != '\0') ||
              (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar18[0x1f] < '\0') {
            auVar135 = vandps_avx(auVar157,auVar17);
            auVar157 = vcmpps_avx(auVar104,ZEXT832(0) << 0x20,2);
            auVar245 = ZEXT3264(auVar157);
            auVar138._8_4_ = 0xff800000;
            auVar138._0_8_ = 0xff800000ff800000;
            auVar138._12_4_ = 0xff800000;
            auVar138._16_4_ = 0xff800000;
            auVar138._20_4_ = 0xff800000;
            auVar138._24_4_ = 0xff800000;
            auVar138._28_4_ = 0xff800000;
            auVar265._8_4_ = 0x7f800000;
            auVar265._0_8_ = 0x7f8000007f800000;
            auVar265._12_4_ = 0x7f800000;
            auVar265._16_4_ = 0x7f800000;
            auVar265._20_4_ = 0x7f800000;
            auVar265._24_4_ = 0x7f800000;
            auVar265._28_4_ = 0x7f800000;
            auVar104 = vblendvps_avx(auVar265,auVar138,auVar157);
            auVar100 = vpackssdw_avx(auVar135._0_16_,auVar135._16_16_);
            auVar18 = vpmovsxwd_avx2(auVar100);
            auVar221 = vblendvps_avx(auVar221,auVar104,auVar18);
            auVar104 = vblendvps_avx(auVar138,auVar265,auVar157);
            auVar230 = vblendvps_avx(auVar230,auVar104,auVar18);
            auVar240._0_8_ = auVar135._0_8_ ^ 0xffffffffffffffff;
            auVar240._8_4_ = auVar135._8_4_ ^ 0xffffffff;
            auVar240._12_4_ = auVar135._12_4_ ^ 0xffffffff;
            auVar240._16_4_ = auVar135._16_4_ ^ 0xffffffff;
            auVar240._20_4_ = auVar135._20_4_ ^ 0xffffffff;
            auVar240._24_4_ = auVar135._24_4_ ^ 0xffffffff;
            auVar240._28_4_ = auVar135._28_4_ ^ 0xffffffff;
            auVar135 = vorps_avx(auVar157,auVar240);
            auVar135 = vandps_avx(auVar135,auVar17);
          }
        }
        uVar91 = *(undefined4 *)&(ray->dir).field_0;
        local_5e0._4_4_ = uVar91;
        local_5e0._0_4_ = uVar91;
        local_5e0._8_4_ = uVar91;
        local_5e0._12_4_ = uVar91;
        local_5e0._16_4_ = uVar91;
        local_5e0._20_4_ = uVar91;
        local_5e0._24_4_ = uVar91;
        local_5e0._28_4_ = uVar91;
        auVar242 = ZEXT3264(local_5e0);
        uVar91 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
        local_600._4_4_ = uVar91;
        local_600._0_4_ = uVar91;
        local_600._8_4_ = uVar91;
        local_600._12_4_ = uVar91;
        local_600._16_4_ = uVar91;
        local_600._20_4_ = uVar91;
        local_600._24_4_ = uVar91;
        local_600._28_4_ = uVar91;
        auVar252 = ZEXT3264(local_600);
        fVar118 = (ray->dir).field_0.m128[2];
        local_480 = _local_660;
        local_460 = vminps_avx(local_4a0,auVar221);
        local_6e0 = vmaxps_avx(_local_660,auVar230);
        local_4c0 = local_6e0;
        auVar104 = vcmpps_avx(_local_660,local_460,2);
        local_560 = vandps_avx(auVar104,local_940);
        auVar104 = vcmpps_avx(local_6e0,local_4a0,2);
        local_5a0 = vandps_avx(auVar104,local_940);
        auVar104 = vorps_avx(local_5a0,local_560);
        if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar104 >> 0x7f,0) != '\0') ||
              (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar104 >> 0xbf,0) != '\0') ||
            (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar104[0x1f] < '\0') {
          local_640._0_8_ = auVar135._0_8_ ^ 0xffffffffffffffff;
          local_640._8_4_ = auVar135._8_4_ ^ 0xffffffff;
          local_640._12_4_ = auVar135._12_4_ ^ 0xffffffff;
          local_640._16_4_ = auVar135._16_4_ ^ 0xffffffff;
          local_640._20_4_ = auVar135._20_4_ ^ 0xffffffff;
          local_640._24_4_ = auVar135._24_4_ ^ 0xffffffff;
          local_640._28_4_ = auVar135._28_4_ ^ 0xffffffff;
          auVar70._4_4_ = fVar118 * auVar201._4_4_;
          auVar70._0_4_ = fVar118 * auVar201._0_4_;
          auVar70._8_4_ = fVar118 * auVar201._8_4_;
          auVar70._12_4_ = fVar118 * auVar201._12_4_;
          auVar70._16_4_ = fVar118 * auVar201._16_4_;
          auVar70._20_4_ = fVar118 * auVar201._20_4_;
          auVar70._24_4_ = fVar118 * auVar201._24_4_;
          auVar70._28_4_ = auVar104._28_4_;
          auVar100 = vfmadd213ps_fma(auVar186,local_600,auVar70);
          auVar100 = vfmadd213ps_fma(auVar158,local_5e0,ZEXT1632(auVar100));
          auVar135 = vandps_avx(ZEXT1632(auVar100),local_7e0);
          auVar133._8_4_ = 0x3e99999a;
          auVar133._0_8_ = 0x3e99999a3e99999a;
          auVar133._12_4_ = 0x3e99999a;
          auVar133._16_4_ = 0x3e99999a;
          auVar133._20_4_ = 0x3e99999a;
          auVar133._24_4_ = 0x3e99999a;
          auVar133._28_4_ = 0x3e99999a;
          auVar135 = vcmpps_avx(auVar135,auVar133,1);
          auVar135 = vorps_avx(auVar135,local_640);
          auVar134._8_4_ = 3;
          auVar134._0_8_ = 0x300000003;
          auVar134._12_4_ = 3;
          auVar134._16_4_ = 3;
          auVar134._20_4_ = 3;
          auVar134._24_4_ = 3;
          auVar134._28_4_ = 3;
          auVar159._8_4_ = 2;
          auVar159._0_8_ = 0x200000002;
          auVar159._12_4_ = 2;
          auVar159._16_4_ = 2;
          auVar159._20_4_ = 2;
          auVar159._24_4_ = 2;
          auVar159._28_4_ = 2;
          auVar135 = vblendvps_avx(auVar159,auVar134,auVar135);
          local_5c0._4_4_ = local_b44;
          local_5c0._0_4_ = local_b44;
          local_5c0._8_4_ = local_b44;
          local_5c0._12_4_ = local_b44;
          local_5c0._16_4_ = local_b44;
          local_5c0._20_4_ = local_b44;
          local_5c0._24_4_ = local_b44;
          local_5c0._28_4_ = local_b44;
          local_580 = vpcmpgtd_avx2(auVar135,local_5c0);
          local_500 = vpandn_avx2(local_580,local_560);
          auVar139 = ZEXT3264(local_500);
          auVar135 = local_560 & ~local_580;
          if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar135 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar135 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar135 >> 0x7f,0) == '\0') &&
                (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar135 >> 0xbf,0) == '\0') &&
              (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar135[0x1f]) {
            fVar141 = ray->tfar;
            auVar109._4_4_ = fVar141;
            auVar109._0_4_ = fVar141;
            auVar109._8_4_ = fVar141;
            auVar109._12_4_ = fVar141;
            auVar109._16_4_ = fVar141;
            auVar109._20_4_ = fVar141;
            auVar109._24_4_ = fVar141;
            auVar109._28_4_ = fVar141;
            auVar135 = local_640;
            fVar141 = fVar118;
            fVar142 = fVar118;
            fVar143 = fVar118;
            fVar146 = fVar118;
            fVar144 = fVar118;
            fVar145 = fVar118;
            local_640 = ZEXT1632(auVar149);
            local_600 = auVar20;
            local_5e0 = auVar19;
            auStack_870 = auVar234._16_16_;
          }
          else {
            local_620._4_4_ = fVar118;
            local_620._0_4_ = fVar118;
            fStack_618 = fVar118;
            fStack_614 = fVar118;
            fStack_610 = fVar118;
            fStack_60c = fVar118;
            fStack_608 = fVar118;
            fStack_604 = fVar118;
            auVar100 = vminps_avx(local_a20,local_a40);
            auVar149 = vmaxps_avx(local_a20,local_a40);
            auVar243 = vminps_avx(local_a30,_local_a50);
            auVar213 = vminps_avx(auVar100,auVar243);
            auVar100 = vmaxps_avx(local_a30,_local_a50);
            auVar243 = vmaxps_avx(auVar149,auVar100);
            local_880._8_4_ = 0x7fffffff;
            local_880._0_8_ = 0x7fffffff7fffffff;
            local_880._12_4_ = 0x7fffffff;
            auVar149 = vandps_avx(auVar213,local_880);
            auStack_870 = auVar234._16_16_;
            auVar100 = vandps_avx(auVar243,local_880);
            auVar149 = vmaxps_avx(auVar149,auVar100);
            auVar100 = vmovshdup_avx(auVar149);
            auVar100 = vmaxss_avx(auVar100,auVar149);
            auVar149 = vshufpd_avx(auVar149,auVar149,1);
            auVar149 = vmaxss_avx(auVar149,auVar100);
            local_940._0_4_ = auVar149._0_4_ * 1.9073486e-06;
            local_7c0 = vshufps_avx(auVar243,auVar243,0xff);
            local_9e0._4_4_ = (float)local_660._4_4_ + (float)local_8a0._4_4_;
            local_9e0._0_4_ = (float)local_660._0_4_ + (float)local_8a0._0_4_;
            fStack_9d8 = fStack_658 + fStack_898;
            fStack_9d4 = fStack_654 + fStack_894;
            fStack_9d0 = fStack_650 + fStack_890;
            fStack_9cc = fStack_64c + fStack_88c;
            fStack_9c8 = fStack_648 + fStack_888;
            fStack_9c4 = fStack_644 + fStack_884;
            do {
              auVar110._8_4_ = 0x7f800000;
              auVar110._0_8_ = 0x7f8000007f800000;
              auVar110._12_4_ = 0x7f800000;
              auVar110._16_4_ = 0x7f800000;
              auVar110._20_4_ = 0x7f800000;
              auVar110._24_4_ = 0x7f800000;
              auVar110._28_4_ = 0x7f800000;
              auVar135 = auVar139._0_32_;
              auVar104 = vblendvps_avx(auVar110,_local_660,auVar135);
              auVar157 = vshufps_avx(auVar104,auVar104,0xb1);
              auVar157 = vminps_avx(auVar104,auVar157);
              auVar17 = vshufpd_avx(auVar157,auVar157,5);
              auVar157 = vminps_avx(auVar157,auVar17);
              auVar17 = vpermpd_avx2(auVar157,0x4e);
              auVar157 = vminps_avx(auVar157,auVar17);
              auVar104 = vcmpps_avx(auVar104,auVar157,0);
              auVar157 = auVar135 & auVar104;
              if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar157 >> 0x7f,0) != '\0') ||
                    (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar157 >> 0xbf,0) != '\0') ||
                  (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar157[0x1f] < '\0') {
                auVar135 = vandps_avx(auVar104,auVar135);
              }
              uVar83 = vmovmskps_avx(auVar135);
              iVar21 = 0;
              for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
                iVar21 = iVar21 + 1;
              }
              uVar84 = iVar21 << 2;
              *(undefined4 *)(local_500 + uVar84) = 0;
              aVar2 = (ray->dir).field_0;
              local_9a0._0_16_ = (undefined1  [16])aVar2;
              auVar149 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
              uVar83 = *(uint *)(local_1a0 + uVar84);
              if (auVar149._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416(*(uint *)(local_480 + uVar84));
                fVar118 = sqrtf(auVar149._0_4_);
                auVar149 = local_ae0._0_16_;
              }
              else {
                auVar149 = vsqrtss_avx(auVar149,auVar149);
                fVar118 = auVar149._0_4_;
                auVar149 = ZEXT416(*(uint *)(local_480 + uVar84));
              }
              local_740._0_4_ = fVar118 * 1.9073486e-06;
              auVar149 = vinsertps_avx(auVar149,ZEXT416(uVar83),0x10);
              bVar90 = true;
              uVar86 = 0;
              do {
                local_960._0_16_ = vmovshdup_avx(auVar149);
                fVar146 = 1.0 - local_960._0_4_;
                auVar100 = vshufps_avx(auVar149,auVar149,0x55);
                fVar118 = auVar100._0_4_;
                auVar120._0_4_ = local_a40._0_4_ * fVar118;
                fVar141 = auVar100._4_4_;
                auVar120._4_4_ = local_a40._4_4_ * fVar141;
                fVar142 = auVar100._8_4_;
                auVar120._8_4_ = local_a40._8_4_ * fVar142;
                fVar143 = auVar100._12_4_;
                auVar120._12_4_ = local_a40._12_4_ * fVar143;
                auVar150._4_4_ = fVar146;
                auVar150._0_4_ = fVar146;
                auVar150._8_4_ = fVar146;
                auVar150._12_4_ = fVar146;
                auVar100 = vfmadd231ps_fma(auVar120,auVar150,local_a20);
                auVar165._0_4_ = local_a30._0_4_ * fVar118;
                auVar165._4_4_ = local_a30._4_4_ * fVar141;
                auVar165._8_4_ = local_a30._8_4_ * fVar142;
                auVar165._12_4_ = local_a30._12_4_ * fVar143;
                auVar243 = vfmadd231ps_fma(auVar165,auVar150,local_a40);
                auVar212._0_4_ = fVar118 * auVar243._0_4_;
                auVar212._4_4_ = fVar141 * auVar243._4_4_;
                auVar212._8_4_ = fVar142 * auVar243._8_4_;
                auVar212._12_4_ = fVar143 * auVar243._12_4_;
                auVar213 = vfmadd231ps_fma(auVar212,auVar150,auVar100);
                auVar121._0_4_ = fVar118 * (float)local_a50._0_4_;
                auVar121._4_4_ = fVar141 * (float)local_a50._4_4_;
                auVar121._8_4_ = fVar142 * fStack_a48;
                auVar121._12_4_ = fVar143 * fStack_a44;
                auVar100 = vfmadd231ps_fma(auVar121,auVar150,local_a30);
                auVar195._0_4_ = fVar118 * auVar100._0_4_;
                auVar195._4_4_ = fVar141 * auVar100._4_4_;
                auVar195._8_4_ = fVar142 * auVar100._8_4_;
                auVar195._12_4_ = fVar143 * auVar100._12_4_;
                local_ac0._0_16_ = vfmadd231ps_fma(auVar195,auVar150,auVar243);
                fVar144 = auVar149._0_4_;
                auVar122._4_4_ = fVar144;
                auVar122._0_4_ = fVar144;
                auVar122._8_4_ = fVar144;
                auVar122._12_4_ = fVar144;
                auVar100 = vfmadd213ps_fma(auVar122,local_9a0._0_16_,_DAT_01f7aa10);
                auVar96._0_4_ = fVar118 * local_ac0._0_4_;
                auVar96._4_4_ = fVar141 * local_ac0._4_4_;
                auVar96._8_4_ = fVar142 * local_ac0._8_4_;
                auVar96._12_4_ = fVar143 * local_ac0._12_4_;
                auVar243 = vfmadd231ps_fma(auVar96,auVar213,auVar150);
                local_720._0_16_ = auVar243;
                auVar100 = vsubps_avx(auVar100,auVar243);
                _local_8c0 = auVar100;
                auVar100 = vdpps_avx(auVar100,auVar100,0x7f);
                local_ae0._0_16_ = auVar100;
                if (auVar100._0_4_ < 0.0) {
                  local_980._0_16_ = ZEXT416((uint)fVar146);
                  local_aa0._0_16_ = auVar213;
                  auVar116._0_4_ = sqrtf(auVar100._0_4_);
                  auVar116._4_60_ = extraout_var;
                  auVar100 = auVar116._0_16_;
                  auVar213 = local_aa0._0_16_;
                  auVar243 = local_980._0_16_;
                }
                else {
                  auVar100 = vsqrtss_avx(auVar100,auVar100);
                  auVar243 = ZEXT416((uint)fVar146);
                }
                auVar213 = vsubps_avx(local_ac0._0_16_,auVar213);
                auVar228._0_4_ = auVar213._0_4_ * 3.0;
                auVar228._4_4_ = auVar213._4_4_ * 3.0;
                auVar228._8_4_ = auVar213._8_4_ * 3.0;
                auVar228._12_4_ = auVar213._12_4_ * 3.0;
                auVar213 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar243,local_960._0_16_)
                ;
                auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_960._0_16_,auVar243);
                fVar118 = auVar243._0_4_ * 6.0;
                fVar141 = auVar213._0_4_ * 6.0;
                fVar142 = auVar4._0_4_ * 6.0;
                fVar143 = local_960._0_4_ * 6.0;
                auVar166._0_4_ = fVar143 * (float)local_a50._0_4_;
                auVar166._4_4_ = fVar143 * (float)local_a50._4_4_;
                auVar166._8_4_ = fVar143 * fStack_a48;
                auVar166._12_4_ = fVar143 * fStack_a44;
                auVar123._4_4_ = fVar142;
                auVar123._0_4_ = fVar142;
                auVar123._8_4_ = fVar142;
                auVar123._12_4_ = fVar142;
                auVar243 = vfmadd132ps_fma(auVar123,auVar166,local_a30);
                auVar167._4_4_ = fVar141;
                auVar167._0_4_ = fVar141;
                auVar167._8_4_ = fVar141;
                auVar167._12_4_ = fVar141;
                auVar243 = vfmadd132ps_fma(auVar167,auVar243,local_a40);
                auVar213 = vdpps_avx(auVar228,auVar228,0x7f);
                auVar124._4_4_ = fVar118;
                auVar124._0_4_ = fVar118;
                auVar124._8_4_ = fVar118;
                auVar124._12_4_ = fVar118;
                auVar5 = vfmadd132ps_fma(auVar124,auVar243,local_a20);
                auVar243 = vblendps_avx(auVar213,_DAT_01f7aa10,0xe);
                auVar4 = vrsqrtss_avx(auVar243,auVar243);
                fVar142 = auVar213._0_4_;
                fVar118 = auVar4._0_4_;
                auVar4 = vdpps_avx(auVar228,auVar5,0x7f);
                fVar118 = fVar118 * 1.5 + fVar142 * -0.5 * fVar118 * fVar118 * fVar118;
                auVar125._0_4_ = auVar5._0_4_ * fVar142;
                auVar125._4_4_ = auVar5._4_4_ * fVar142;
                auVar125._8_4_ = auVar5._8_4_ * fVar142;
                auVar125._12_4_ = auVar5._12_4_ * fVar142;
                fVar141 = auVar4._0_4_;
                auVar214._0_4_ = auVar228._0_4_ * fVar141;
                auVar214._4_4_ = auVar228._4_4_ * fVar141;
                auVar214._8_4_ = auVar228._8_4_ * fVar141;
                auVar214._12_4_ = auVar228._12_4_ * fVar141;
                auVar4 = vsubps_avx(auVar125,auVar214);
                auVar243 = vrcpss_avx(auVar243,auVar243);
                auVar5 = vfnmadd213ss_fma(auVar243,auVar213,ZEXT416(0x40000000));
                fVar141 = auVar243._0_4_ * auVar5._0_4_;
                auVar243 = vmaxss_avx(ZEXT416((uint)local_940._0_4_),
                                      ZEXT416((uint)(fVar144 * (float)local_740._0_4_)));
                auVar252 = ZEXT1664(auVar243);
                uVar72 = CONCAT44(auVar228._4_4_,auVar228._0_4_);
                local_ac0._0_8_ = uVar72 ^ 0x8000000080000000;
                local_ac0._8_4_ = -auVar228._8_4_;
                local_ac0._12_4_ = -auVar228._12_4_;
                auVar168._0_4_ = fVar118 * auVar4._0_4_ * fVar141;
                auVar168._4_4_ = fVar118 * auVar4._4_4_ * fVar141;
                auVar168._8_4_ = fVar118 * auVar4._8_4_ * fVar141;
                auVar168._12_4_ = fVar118 * auVar4._12_4_ * fVar141;
                local_8e0._0_4_ = auVar228._0_4_ * fVar118;
                local_8e0._4_4_ = auVar228._4_4_ * fVar118;
                local_8e0._8_4_ = auVar228._8_4_ * fVar118;
                local_8e0._12_4_ = auVar228._12_4_ * fVar118;
                local_960._0_16_ = auVar228;
                local_980._0_4_ = auVar243._0_4_;
                if (fVar142 < -fVar142) {
                  local_aa0._0_4_ = auVar100._0_4_;
                  local_9c0._0_16_ = auVar168;
                  fVar118 = sqrtf(fVar142);
                  auVar100 = ZEXT416((uint)local_aa0._0_4_);
                  auVar252 = ZEXT464((uint)local_980._0_4_);
                  auVar168 = local_9c0._0_16_;
                }
                else {
                  auVar243 = vsqrtss_avx(auVar213,auVar213);
                  fVar118 = auVar243._0_4_;
                }
                auVar243 = vdpps_avx(_local_8c0,local_8e0._0_16_,0x7f);
                auVar6 = vfmadd213ss_fma(ZEXT416((uint)local_940._0_4_),auVar100,auVar252._0_16_);
                auVar213 = vdpps_avx(local_ac0._0_16_,local_8e0._0_16_,0x7f);
                auVar4 = vdpps_avx(_local_8c0,auVar168,0x7f);
                auVar5 = vdpps_avx(local_9a0._0_16_,local_8e0._0_16_,0x7f);
                auVar100 = vfmadd213ss_fma(ZEXT416((uint)(auVar100._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_940._0_4_ / fVar118)),auVar6)
                ;
                local_aa0._0_4_ = auVar100._0_4_;
                auVar97._0_4_ = auVar243._0_4_ * auVar243._0_4_;
                auVar97._4_4_ = auVar243._4_4_ * auVar243._4_4_;
                auVar97._8_4_ = auVar243._8_4_ * auVar243._8_4_;
                auVar97._12_4_ = auVar243._12_4_ * auVar243._12_4_;
                auVar100 = vdpps_avx(_local_8c0,local_ac0._0_16_,0x7f);
                auVar7 = vsubps_avx(local_ae0._0_16_,auVar97);
                auVar6 = vrsqrtss_avx(auVar7,auVar7);
                fVar141 = auVar7._0_4_;
                fVar118 = auVar6._0_4_;
                fVar118 = fVar118 * 1.5 + fVar141 * -0.5 * fVar118 * fVar118 * fVar118;
                auVar6 = vdpps_avx(_local_8c0,local_9a0._0_16_,0x7f);
                local_ac0._0_16_ = ZEXT416((uint)(auVar213._0_4_ + auVar4._0_4_));
                local_8e0._0_16_ = vfnmadd231ss_fma(auVar100,auVar243,local_ac0._0_16_);
                auVar100 = vfnmadd231ss_fma(auVar6,auVar243,auVar5);
                if (fVar141 < 0.0) {
                  local_9c0._0_16_ = auVar243;
                  local_760._0_16_ = auVar5;
                  local_780._0_4_ = fVar118;
                  local_7a0._0_16_ = auVar100;
                  fVar141 = sqrtf(fVar141);
                  auVar252 = ZEXT464((uint)local_980._0_4_);
                  fVar118 = (float)local_780._0_4_;
                  auVar100 = local_7a0._0_16_;
                  auVar5 = local_760._0_16_;
                  auVar243 = local_9c0._0_16_;
                }
                else {
                  auVar213 = vsqrtss_avx(auVar7,auVar7);
                  fVar141 = auVar213._0_4_;
                }
                auVar245 = ZEXT3264(local_b00);
                auVar213 = vpermilps_avx(local_720._0_16_,0xff);
                fVar141 = fVar141 - auVar213._0_4_;
                auVar4 = vshufps_avx(local_960._0_16_,local_960._0_16_,0xff);
                auVar213 = vfmsub213ss_fma(local_8e0._0_16_,ZEXT416((uint)fVar118),auVar4);
                auVar169._0_8_ = auVar5._0_8_ ^ 0x8000000080000000;
                auVar169._8_4_ = auVar5._8_4_ ^ 0x80000000;
                auVar169._12_4_ = auVar5._12_4_ ^ 0x80000000;
                auVar196._0_8_ = auVar213._0_8_ ^ 0x8000000080000000;
                auVar196._8_4_ = auVar213._8_4_ ^ 0x80000000;
                auVar196._12_4_ = auVar213._12_4_ ^ 0x80000000;
                auVar100 = ZEXT416((uint)(auVar100._0_4_ * fVar118));
                auVar213 = vfmsub231ss_fma(ZEXT416((uint)(auVar5._0_4_ * auVar213._0_4_)),
                                           local_ac0._0_16_,auVar100);
                auVar100 = vinsertps_avx(auVar196,auVar100,0x1c);
                uVar91 = auVar213._0_4_;
                auVar197._4_4_ = uVar91;
                auVar197._0_4_ = uVar91;
                auVar197._8_4_ = uVar91;
                auVar197._12_4_ = uVar91;
                auVar100 = vdivps_avx(auVar100,auVar197);
                auVar213 = vinsertps_avx(local_ac0._0_16_,auVar169,0x10);
                auVar213 = vdivps_avx(auVar213,auVar197);
                fVar118 = auVar243._0_4_;
                auVar151._0_4_ = fVar118 * auVar100._0_4_ + fVar141 * auVar213._0_4_;
                auVar151._4_4_ = fVar118 * auVar100._4_4_ + fVar141 * auVar213._4_4_;
                auVar151._8_4_ = fVar118 * auVar100._8_4_ + fVar141 * auVar213._8_4_;
                auVar151._12_4_ = fVar118 * auVar100._12_4_ + fVar141 * auVar213._12_4_;
                auVar149 = vsubps_avx(auVar149,auVar151);
                auVar100 = vandps_avx(auVar243,local_880);
                if (auVar100._0_4_ < (float)local_aa0._0_4_) {
                  auVar243 = vfmadd231ss_fma(ZEXT416((uint)(auVar252._0_4_ + (float)local_aa0._0_4_)
                                                    ),local_7c0,ZEXT416(0x36000000));
                  auVar100 = vandps_avx(ZEXT416((uint)fVar141),local_880);
                  if (auVar100._0_4_ < auVar243._0_4_) {
                    fVar118 = auVar149._0_4_ + (float)local_860._0_4_;
                    bVar80 = 0;
                    if (((ray->org).field_0.m128[3] <= fVar118) &&
                       (fVar141 = ray->tfar, fVar118 <= fVar141)) {
                      auVar149 = vmovshdup_avx(auVar149);
                      bVar80 = 0;
                      fVar142 = auVar149._0_4_;
                      if ((0.0 <= fVar142) && (fVar142 <= 1.0)) {
                        auVar149 = vrsqrtss_avx(local_ae0._0_16_,local_ae0._0_16_);
                        fVar143 = auVar149._0_4_;
                        pGVar10 = (context->scene->geometries).items[uVar81].ptr;
                        if ((pGVar10->mask & ray->mask) == 0) {
                          bVar80 = 0;
                        }
                        else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                (bVar80 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0))
                        {
                          fVar143 = fVar143 * 1.5 +
                                    local_ae0._0_4_ * -0.5 * fVar143 * fVar143 * fVar143;
                          auVar170._0_4_ = fVar143 * (float)local_8c0._0_4_;
                          auVar170._4_4_ = fVar143 * (float)local_8c0._4_4_;
                          auVar170._8_4_ = fVar143 * fStack_8b8;
                          auVar170._12_4_ = fVar143 * fStack_8b4;
                          auVar213 = vfmadd213ps_fma(auVar4,auVar170,local_960._0_16_);
                          auVar149 = vshufps_avx(auVar170,auVar170,0xc9);
                          auVar100 = vshufps_avx(local_960._0_16_,local_960._0_16_,0xc9);
                          auVar171._0_4_ = auVar170._0_4_ * auVar100._0_4_;
                          auVar171._4_4_ = auVar170._4_4_ * auVar100._4_4_;
                          auVar171._8_4_ = auVar170._8_4_ * auVar100._8_4_;
                          auVar171._12_4_ = auVar170._12_4_ * auVar100._12_4_;
                          auVar243 = vfmsub231ps_fma(auVar171,local_960._0_16_,auVar149);
                          auVar149 = vshufps_avx(auVar243,auVar243,0xc9);
                          auVar100 = vshufps_avx(auVar213,auVar213,0xc9);
                          auVar243 = vshufps_avx(auVar243,auVar243,0xd2);
                          auVar98._0_4_ = auVar213._0_4_ * auVar243._0_4_;
                          auVar98._4_4_ = auVar213._4_4_ * auVar243._4_4_;
                          auVar98._8_4_ = auVar213._8_4_ * auVar243._8_4_;
                          auVar98._12_4_ = auVar213._12_4_ * auVar243._12_4_;
                          auVar100 = vfmsub231ps_fma(auVar98,auVar149,auVar100);
                          auVar149 = vshufps_avx(auVar100,auVar100,0xe9);
                          local_920 = vmovlps_avx(auVar149);
                          local_918 = auVar100._0_4_;
                          local_910 = 0;
                          local_90c = (undefined4)local_8e8;
                          local_904 = context->user->instID[0];
                          local_900 = context->user->instPrimID[0];
                          ray->tfar = fVar118;
                          local_700._0_4_ = 0xffffffff;
                          local_a10.valid = (int *)local_700;
                          local_a10.geometryUserPtr = pGVar10->userPtr;
                          local_a10.context = context->user;
                          local_a10.hit = (RTCHitN *)&local_920;
                          local_a10.N = 1;
                          local_a10.ray = (RTCRayN *)ray;
                          local_914 = fVar142;
                          local_908 = uVar81;
                          if (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0186bf6d:
                            p_Var14 = context->args->filter;
                            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar245 = ZEXT1664(auVar245._0_16_);
                              (*p_Var14)(&local_a10);
                              if (*local_a10.valid == 0) goto LAB_0186bfb1;
                            }
                            bVar80 = 1;
                          }
                          else {
                            auVar245 = ZEXT1664(local_b00._0_16_);
                            (*pGVar10->occlusionFilterN)(&local_a10);
                            if (*local_a10.valid != 0) goto LAB_0186bf6d;
LAB_0186bfb1:
                            ray->tfar = fVar141;
                            bVar80 = 0;
                          }
                        }
                      }
                    }
                    goto LAB_0186bd58;
                  }
                }
                bVar90 = uVar86 < 4;
                uVar86 = uVar86 + 1;
              } while (uVar86 != 5);
              bVar90 = false;
              bVar80 = 5;
LAB_0186bd58:
              bVar87 = (bool)(bVar87 | bVar90 & bVar80);
              fVar118 = ray->tfar;
              auVar109._4_4_ = fVar118;
              auVar109._0_4_ = fVar118;
              auVar109._8_4_ = fVar118;
              auVar109._12_4_ = fVar118;
              auVar109._16_4_ = fVar118;
              auVar109._20_4_ = fVar118;
              auVar109._24_4_ = fVar118;
              auVar109._28_4_ = fVar118;
              auVar104 = vcmpps_avx(_local_9e0,auVar109,2);
              auVar135 = vandps_avx(auVar104,local_500);
              auVar139 = ZEXT3264(auVar135);
              auVar104 = local_500 & auVar104;
              local_500 = auVar135;
            } while ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar104 >> 0x7f,0) != '\0') ||
                       (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar104 >> 0xbf,0) != '\0') ||
                     (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar104[0x1f] < '\0');
            auVar242 = ZEXT3264(local_5e0);
            auVar252 = ZEXT3264(local_600);
            auVar135 = local_640;
            fVar118 = (float)local_620._0_4_;
            fVar141 = (float)local_620._4_4_;
            fVar142 = fStack_618;
            fVar143 = fStack_614;
            fVar146 = fStack_610;
            fVar144 = fStack_60c;
            fVar145 = fStack_608;
          }
          auVar140._0_4_ = fVar118 * (float)local_840._0_4_;
          auVar140._4_4_ = fVar141 * (float)local_840._4_4_;
          auVar140._8_4_ = fVar142 * fStack_838;
          auVar140._12_4_ = fVar143 * fStack_834;
          auVar140._16_4_ = fVar146 * fStack_830;
          auVar140._20_4_ = fVar144 * fStack_82c;
          auVar140._28_36_ = auVar139._28_36_;
          auVar140._24_4_ = fVar145 * fStack_828;
          auVar149 = vfmadd213ps_fma(local_820,auVar252._0_32_,auVar140._0_32_);
          auVar149 = vfmadd213ps_fma(_local_800,auVar242._0_32_,ZEXT1632(auVar149));
          auVar104 = vandps_avx(ZEXT1632(auVar149),local_7e0);
          auVar160._8_4_ = 0x3e99999a;
          auVar160._0_8_ = 0x3e99999a3e99999a;
          auVar160._12_4_ = 0x3e99999a;
          auVar160._16_4_ = 0x3e99999a;
          auVar160._20_4_ = 0x3e99999a;
          auVar160._24_4_ = 0x3e99999a;
          auVar160._28_4_ = 0x3e99999a;
          auVar104 = vcmpps_avx(auVar104,auVar160,1);
          auVar104 = vorps_avx(auVar104,auVar135);
          auVar161._0_4_ = (float)local_8a0._0_4_ + local_6e0._0_4_;
          auVar161._4_4_ = (float)local_8a0._4_4_ + local_6e0._4_4_;
          auVar161._8_4_ = fStack_898 + local_6e0._8_4_;
          auVar161._12_4_ = fStack_894 + local_6e0._12_4_;
          auVar161._16_4_ = fStack_890 + local_6e0._16_4_;
          auVar161._20_4_ = fStack_88c + local_6e0._20_4_;
          auVar161._24_4_ = fStack_888 + local_6e0._24_4_;
          auVar161._28_4_ = fStack_884 + local_6e0._28_4_;
          auVar135 = vcmpps_avx(auVar161,auVar109,2);
          local_820 = vandps_avx(auVar135,local_5a0);
          auVar162._8_4_ = 3;
          auVar162._0_8_ = 0x300000003;
          auVar162._12_4_ = 3;
          auVar162._16_4_ = 3;
          auVar162._20_4_ = 3;
          auVar162._24_4_ = 3;
          auVar162._28_4_ = 3;
          auVar187._8_4_ = 2;
          auVar187._0_8_ = 0x200000002;
          auVar187._12_4_ = 2;
          auVar187._16_4_ = 2;
          auVar187._20_4_ = 2;
          auVar187._24_4_ = 2;
          auVar187._28_4_ = 2;
          auVar135 = vblendvps_avx(auVar187,auVar162,auVar104);
          _local_840 = vpcmpgtd_avx2(auVar135,local_5c0);
          auVar135 = vpandn_avx2(_local_840,local_820);
          auVar104 = local_820 & ~_local_840;
          local_700 = auVar135;
          if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar104 >> 0x7f,0) != '\0') ||
                (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar104 >> 0xbf,0) != '\0') ||
              (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar104[0x1f] < '\0') {
            auVar100 = vminps_avx(local_a20,local_a40);
            auVar149 = vmaxps_avx(local_a20,local_a40);
            auVar243 = vminps_avx(local_a30,_local_a50);
            auVar213 = vminps_avx(auVar100,auVar243);
            auVar100 = vmaxps_avx(local_a30,_local_a50);
            auVar139 = ZEXT3264(local_4c0);
            auVar243 = vmaxps_avx(auVar149,auVar100);
            local_880._8_4_ = 0x7fffffff;
            local_880._0_8_ = 0x7fffffff7fffffff;
            local_880._12_4_ = 0x7fffffff;
            auVar149 = vandps_avx(auVar213,local_880);
            auVar100 = vandps_avx(auVar243,local_880);
            auVar149 = vmaxps_avx(auVar149,auVar100);
            auVar100 = vmovshdup_avx(auVar149);
            auVar100 = vmaxss_avx(auVar100,auVar149);
            auVar149 = vshufpd_avx(auVar149,auVar149,1);
            auVar149 = vmaxss_avx(auVar149,auVar100);
            local_940._0_4_ = auVar149._0_4_ * 1.9073486e-06;
            local_7c0 = vshufps_avx(auVar243,auVar243,0xff);
            local_800._4_4_ = (float)local_8a0._4_4_ + local_4c0._4_4_;
            local_800._0_4_ = (float)local_8a0._0_4_ + local_4c0._0_4_;
            fStack_7f8 = fStack_898 + local_4c0._8_4_;
            fStack_7f4 = fStack_894 + local_4c0._12_4_;
            fStack_7f0 = fStack_890 + local_4c0._16_4_;
            fStack_7ec = fStack_88c + local_4c0._20_4_;
            fStack_7e8 = fStack_888 + local_4c0._24_4_;
            fStack_7e4 = fStack_884 + local_4c0._28_4_;
            _local_9e0 = local_4c0;
            do {
              auVar111._8_4_ = 0x7f800000;
              auVar111._0_8_ = 0x7f8000007f800000;
              auVar111._12_4_ = 0x7f800000;
              auVar111._16_4_ = 0x7f800000;
              auVar111._20_4_ = 0x7f800000;
              auVar111._24_4_ = 0x7f800000;
              auVar111._28_4_ = 0x7f800000;
              auVar104 = vblendvps_avx(auVar111,auVar139._0_32_,auVar135);
              auVar157 = vshufps_avx(auVar104,auVar104,0xb1);
              auVar157 = vminps_avx(auVar104,auVar157);
              auVar17 = vshufpd_avx(auVar157,auVar157,5);
              auVar157 = vminps_avx(auVar157,auVar17);
              auVar17 = vpermpd_avx2(auVar157,0x4e);
              auVar157 = vminps_avx(auVar157,auVar17);
              auVar157 = vcmpps_avx(auVar104,auVar157,0);
              auVar17 = auVar135 & auVar157;
              auVar104 = auVar135;
              if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar17 >> 0x7f,0) != '\0') ||
                    (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar17 >> 0xbf,0) != '\0') ||
                  (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar17[0x1f] < '\0') {
                auVar104 = vandps_avx(auVar157,auVar135);
              }
              uVar83 = vmovmskps_avx(auVar104);
              iVar21 = 0;
              for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
                iVar21 = iVar21 + 1;
              }
              uVar84 = iVar21 << 2;
              local_700 = auVar135;
              *(undefined4 *)(local_700 + uVar84) = 0;
              aVar2 = (ray->dir).field_0;
              local_9a0._0_16_ = (undefined1  [16])aVar2;
              auVar149 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
              uVar83 = *(uint *)(local_1c0 + uVar84);
              if (auVar149._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416(*(uint *)(local_4a0 + uVar84));
                fVar118 = sqrtf(auVar149._0_4_);
                auVar149 = local_ae0._0_16_;
              }
              else {
                auVar149 = vsqrtss_avx(auVar149,auVar149);
                fVar118 = auVar149._0_4_;
                auVar149 = ZEXT416(*(uint *)(local_4a0 + uVar84));
              }
              local_740._0_4_ = fVar118 * 1.9073486e-06;
              auVar149 = vinsertps_avx(auVar149,ZEXT416(uVar83),0x10);
              bVar90 = true;
              uVar86 = 0;
              do {
                local_960._0_16_ = vmovshdup_avx(auVar149);
                fVar146 = 1.0 - local_960._0_4_;
                auVar100 = vshufps_avx(auVar149,auVar149,0x55);
                fVar118 = auVar100._0_4_;
                auVar126._0_4_ = local_a40._0_4_ * fVar118;
                fVar141 = auVar100._4_4_;
                auVar126._4_4_ = local_a40._4_4_ * fVar141;
                fVar142 = auVar100._8_4_;
                auVar126._8_4_ = local_a40._8_4_ * fVar142;
                fVar143 = auVar100._12_4_;
                auVar126._12_4_ = local_a40._12_4_ * fVar143;
                auVar152._4_4_ = fVar146;
                auVar152._0_4_ = fVar146;
                auVar152._8_4_ = fVar146;
                auVar152._12_4_ = fVar146;
                auVar100 = vfmadd231ps_fma(auVar126,auVar152,local_a20);
                auVar172._0_4_ = local_a30._0_4_ * fVar118;
                auVar172._4_4_ = local_a30._4_4_ * fVar141;
                auVar172._8_4_ = local_a30._8_4_ * fVar142;
                auVar172._12_4_ = local_a30._12_4_ * fVar143;
                auVar243 = vfmadd231ps_fma(auVar172,auVar152,local_a40);
                auVar215._0_4_ = fVar118 * auVar243._0_4_;
                auVar215._4_4_ = fVar141 * auVar243._4_4_;
                auVar215._8_4_ = fVar142 * auVar243._8_4_;
                auVar215._12_4_ = fVar143 * auVar243._12_4_;
                auVar213 = vfmadd231ps_fma(auVar215,auVar152,auVar100);
                auVar127._0_4_ = fVar118 * (float)local_a50._0_4_;
                auVar127._4_4_ = fVar141 * (float)local_a50._4_4_;
                auVar127._8_4_ = fVar142 * fStack_a48;
                auVar127._12_4_ = fVar143 * fStack_a44;
                auVar100 = vfmadd231ps_fma(auVar127,auVar152,local_a30);
                auVar198._0_4_ = fVar118 * auVar100._0_4_;
                auVar198._4_4_ = fVar141 * auVar100._4_4_;
                auVar198._8_4_ = fVar142 * auVar100._8_4_;
                auVar198._12_4_ = fVar143 * auVar100._12_4_;
                local_ac0._0_16_ = vfmadd231ps_fma(auVar198,auVar152,auVar243);
                fVar144 = auVar149._0_4_;
                auVar128._4_4_ = fVar144;
                auVar128._0_4_ = fVar144;
                auVar128._8_4_ = fVar144;
                auVar128._12_4_ = fVar144;
                auVar100 = vfmadd213ps_fma(auVar128,local_9a0._0_16_,_DAT_01f7aa10);
                auVar99._0_4_ = fVar118 * local_ac0._0_4_;
                auVar99._4_4_ = fVar141 * local_ac0._4_4_;
                auVar99._8_4_ = fVar142 * local_ac0._8_4_;
                auVar99._12_4_ = fVar143 * local_ac0._12_4_;
                auVar243 = vfmadd231ps_fma(auVar99,auVar213,auVar152);
                local_720._0_16_ = auVar243;
                auVar100 = vsubps_avx(auVar100,auVar243);
                _local_8c0 = auVar100;
                auVar100 = vdpps_avx(auVar100,auVar100,0x7f);
                local_ae0._0_16_ = auVar100;
                if (auVar100._0_4_ < 0.0) {
                  local_980._0_16_ = ZEXT416((uint)fVar146);
                  local_aa0._0_16_ = auVar213;
                  auVar117._0_4_ = sqrtf(auVar100._0_4_);
                  auVar117._4_60_ = extraout_var_00;
                  auVar100 = auVar117._0_16_;
                  auVar213 = local_aa0._0_16_;
                  auVar243 = local_980._0_16_;
                }
                else {
                  auVar100 = vsqrtss_avx(auVar100,auVar100);
                  auVar243 = ZEXT416((uint)fVar146);
                }
                auVar213 = vsubps_avx(local_ac0._0_16_,auVar213);
                auVar229._0_4_ = auVar213._0_4_ * 3.0;
                auVar229._4_4_ = auVar213._4_4_ * 3.0;
                auVar229._8_4_ = auVar213._8_4_ * 3.0;
                auVar229._12_4_ = auVar213._12_4_ * 3.0;
                auVar213 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar243,local_960._0_16_)
                ;
                auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_960._0_16_,auVar243);
                fVar118 = auVar243._0_4_ * 6.0;
                fVar141 = auVar213._0_4_ * 6.0;
                fVar142 = auVar4._0_4_ * 6.0;
                fVar143 = local_960._0_4_ * 6.0;
                auVar173._0_4_ = fVar143 * (float)local_a50._0_4_;
                auVar173._4_4_ = fVar143 * (float)local_a50._4_4_;
                auVar173._8_4_ = fVar143 * fStack_a48;
                auVar173._12_4_ = fVar143 * fStack_a44;
                auVar129._4_4_ = fVar142;
                auVar129._0_4_ = fVar142;
                auVar129._8_4_ = fVar142;
                auVar129._12_4_ = fVar142;
                auVar243 = vfmadd132ps_fma(auVar129,auVar173,local_a30);
                auVar174._4_4_ = fVar141;
                auVar174._0_4_ = fVar141;
                auVar174._8_4_ = fVar141;
                auVar174._12_4_ = fVar141;
                auVar243 = vfmadd132ps_fma(auVar174,auVar243,local_a40);
                auVar213 = vdpps_avx(auVar229,auVar229,0x7f);
                auVar130._4_4_ = fVar118;
                auVar130._0_4_ = fVar118;
                auVar130._8_4_ = fVar118;
                auVar130._12_4_ = fVar118;
                auVar5 = vfmadd132ps_fma(auVar130,auVar243,local_a20);
                auVar243 = vblendps_avx(auVar213,_DAT_01f7aa10,0xe);
                auVar4 = vrsqrtss_avx(auVar243,auVar243);
                fVar142 = auVar213._0_4_;
                fVar118 = auVar4._0_4_;
                auVar4 = vdpps_avx(auVar229,auVar5,0x7f);
                fVar118 = fVar118 * 1.5 + fVar142 * -0.5 * fVar118 * fVar118 * fVar118;
                auVar131._0_4_ = auVar5._0_4_ * fVar142;
                auVar131._4_4_ = auVar5._4_4_ * fVar142;
                auVar131._8_4_ = auVar5._8_4_ * fVar142;
                auVar131._12_4_ = auVar5._12_4_ * fVar142;
                fVar141 = auVar4._0_4_;
                auVar216._0_4_ = auVar229._0_4_ * fVar141;
                auVar216._4_4_ = auVar229._4_4_ * fVar141;
                auVar216._8_4_ = auVar229._8_4_ * fVar141;
                auVar216._12_4_ = auVar229._12_4_ * fVar141;
                auVar4 = vsubps_avx(auVar131,auVar216);
                auVar243 = vrcpss_avx(auVar243,auVar243);
                auVar5 = vfnmadd213ss_fma(auVar243,auVar213,ZEXT416(0x40000000));
                fVar141 = auVar243._0_4_ * auVar5._0_4_;
                auVar243 = vmaxss_avx(ZEXT416((uint)local_940._0_4_),
                                      ZEXT416((uint)(fVar144 * (float)local_740._0_4_)));
                auVar252 = ZEXT1664(auVar243);
                uVar72 = CONCAT44(auVar229._4_4_,auVar229._0_4_);
                local_ac0._0_8_ = uVar72 ^ 0x8000000080000000;
                local_ac0._8_4_ = -auVar229._8_4_;
                local_ac0._12_4_ = -auVar229._12_4_;
                auVar175._0_4_ = fVar118 * auVar4._0_4_ * fVar141;
                auVar175._4_4_ = fVar118 * auVar4._4_4_ * fVar141;
                auVar175._8_4_ = fVar118 * auVar4._8_4_ * fVar141;
                auVar175._12_4_ = fVar118 * auVar4._12_4_ * fVar141;
                local_8e0._0_4_ = auVar229._0_4_ * fVar118;
                local_8e0._4_4_ = auVar229._4_4_ * fVar118;
                local_8e0._8_4_ = auVar229._8_4_ * fVar118;
                local_8e0._12_4_ = auVar229._12_4_ * fVar118;
                local_960._0_16_ = auVar229;
                local_980._0_4_ = auVar243._0_4_;
                if (fVar142 < -fVar142) {
                  local_aa0._0_4_ = auVar100._0_4_;
                  local_9c0._0_16_ = auVar175;
                  fVar118 = sqrtf(fVar142);
                  auVar100 = ZEXT416((uint)local_aa0._0_4_);
                  auVar252 = ZEXT464((uint)local_980._0_4_);
                  auVar175 = local_9c0._0_16_;
                  auVar243 = local_8e0._0_16_;
                }
                else {
                  auVar243 = vsqrtss_avx(auVar213,auVar213);
                  fVar118 = auVar243._0_4_;
                  auVar243 = local_8e0._0_16_;
                }
                auVar245 = ZEXT1664(auVar243);
                auVar213 = vdpps_avx(_local_8c0,auVar243,0x7f);
                auVar7 = vfmadd213ss_fma(ZEXT416((uint)local_940._0_4_),auVar100,auVar252._0_16_);
                auVar4 = vdpps_avx(local_ac0._0_16_,auVar243,0x7f);
                auVar5 = vdpps_avx(_local_8c0,auVar175,0x7f);
                auVar6 = vdpps_avx(local_9a0._0_16_,auVar243,0x7f);
                auVar100 = vfmadd213ss_fma(ZEXT416((uint)(auVar100._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_940._0_4_ / fVar118)),auVar7)
                ;
                local_aa0._0_4_ = auVar100._0_4_;
                auVar101._0_4_ = auVar213._0_4_ * auVar213._0_4_;
                auVar101._4_4_ = auVar213._4_4_ * auVar213._4_4_;
                auVar101._8_4_ = auVar213._8_4_ * auVar213._8_4_;
                auVar101._12_4_ = auVar213._12_4_ * auVar213._12_4_;
                auVar100 = vdpps_avx(_local_8c0,local_ac0._0_16_,0x7f);
                auVar8 = vsubps_avx(local_ae0._0_16_,auVar101);
                auVar7 = vrsqrtss_avx(auVar8,auVar8);
                fVar141 = auVar8._0_4_;
                fVar118 = auVar7._0_4_;
                fVar118 = fVar118 * 1.5 + fVar141 * -0.5 * fVar118 * fVar118 * fVar118;
                auVar7 = vdpps_avx(_local_8c0,local_9a0._0_16_,0x7f);
                local_ac0._0_16_ = ZEXT416((uint)(auVar4._0_4_ + auVar5._0_4_));
                local_8e0._0_16_ = vfnmadd231ss_fma(auVar100,auVar213,local_ac0._0_16_);
                auVar100 = vfnmadd231ss_fma(auVar7,auVar213,auVar6);
                if (fVar141 < 0.0) {
                  local_9c0._0_16_ = auVar213;
                  local_760._0_16_ = auVar6;
                  local_780._0_4_ = fVar118;
                  local_7a0._0_16_ = auVar100;
                  auVar245 = ZEXT1664(auVar243);
                  fVar141 = sqrtf(fVar141);
                  auVar252 = ZEXT464((uint)local_980._0_4_);
                  fVar118 = (float)local_780._0_4_;
                  auVar100 = local_7a0._0_16_;
                  auVar6 = local_760._0_16_;
                  auVar213 = local_9c0._0_16_;
                }
                else {
                  auVar243 = vsqrtss_avx(auVar8,auVar8);
                  fVar141 = auVar243._0_4_;
                }
                auVar242 = ZEXT1664(local_ae0._0_16_);
                auVar243 = vpermilps_avx(local_720._0_16_,0xff);
                fVar141 = fVar141 - auVar243._0_4_;
                auVar4 = vshufps_avx(local_960._0_16_,local_960._0_16_,0xff);
                auVar243 = vfmsub213ss_fma(local_8e0._0_16_,ZEXT416((uint)fVar118),auVar4);
                auVar176._0_8_ = auVar6._0_8_ ^ 0x8000000080000000;
                auVar176._8_4_ = auVar6._8_4_ ^ 0x80000000;
                auVar176._12_4_ = auVar6._12_4_ ^ 0x80000000;
                auVar199._0_8_ = auVar243._0_8_ ^ 0x8000000080000000;
                auVar199._8_4_ = auVar243._8_4_ ^ 0x80000000;
                auVar199._12_4_ = auVar243._12_4_ ^ 0x80000000;
                auVar100 = ZEXT416((uint)(auVar100._0_4_ * fVar118));
                auVar243 = vfmsub231ss_fma(ZEXT416((uint)(auVar6._0_4_ * auVar243._0_4_)),
                                           local_ac0._0_16_,auVar100);
                auVar100 = vinsertps_avx(auVar199,auVar100,0x1c);
                uVar91 = auVar243._0_4_;
                auVar200._4_4_ = uVar91;
                auVar200._0_4_ = uVar91;
                auVar200._8_4_ = uVar91;
                auVar200._12_4_ = uVar91;
                auVar100 = vdivps_avx(auVar100,auVar200);
                auVar243 = vinsertps_avx(local_ac0._0_16_,auVar176,0x10);
                auVar243 = vdivps_avx(auVar243,auVar200);
                fVar118 = auVar213._0_4_;
                auVar153._0_4_ = fVar118 * auVar100._0_4_ + fVar141 * auVar243._0_4_;
                auVar153._4_4_ = fVar118 * auVar100._4_4_ + fVar141 * auVar243._4_4_;
                auVar153._8_4_ = fVar118 * auVar100._8_4_ + fVar141 * auVar243._8_4_;
                auVar153._12_4_ = fVar118 * auVar100._12_4_ + fVar141 * auVar243._12_4_;
                auVar149 = vsubps_avx(auVar149,auVar153);
                auVar100 = vandps_avx(auVar213,local_880);
                if (auVar100._0_4_ < (float)local_aa0._0_4_) {
                  auVar243 = vfmadd231ss_fma(ZEXT416((uint)(auVar252._0_4_ + (float)local_aa0._0_4_)
                                                    ),local_7c0,ZEXT416(0x36000000));
                  auVar100 = vandps_avx(ZEXT416((uint)fVar141),local_880);
                  if (auVar100._0_4_ < auVar243._0_4_) {
                    fVar118 = auVar149._0_4_ + (float)local_860._0_4_;
                    bVar80 = 0;
                    if (fVar118 < (ray->org).field_0.m128[3]) goto LAB_0186c6f4;
                    fVar141 = ray->tfar;
                    auVar252 = ZEXT464((uint)fVar141);
                    auVar139 = ZEXT3264(_local_9e0);
                    bVar80 = 0;
                    if (fVar141 < fVar118) goto LAB_0186c6f4;
                    auVar149 = vmovshdup_avx(auVar149);
                    bVar80 = 0;
                    fVar142 = auVar149._0_4_;
                    if (fVar142 < 0.0) goto LAB_0186c6f4;
                    if (fVar142 <= 1.0) {
                      auVar149 = vrsqrtss_avx(local_ae0._0_16_,local_ae0._0_16_);
                      fVar143 = auVar149._0_4_;
                      pGVar10 = (context->scene->geometries).items[uVar81].ptr;
                      if ((pGVar10->mask & ray->mask) == 0) {
                        bVar80 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar80 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar143 = fVar143 * 1.5 +
                                  local_ae0._0_4_ * -0.5 * fVar143 * fVar143 * fVar143;
                        auVar177._0_4_ = fVar143 * (float)local_8c0._0_4_;
                        auVar177._4_4_ = fVar143 * (float)local_8c0._4_4_;
                        auVar177._8_4_ = fVar143 * fStack_8b8;
                        auVar177._12_4_ = fVar143 * fStack_8b4;
                        auVar213 = vfmadd213ps_fma(auVar4,auVar177,local_960._0_16_);
                        auVar149 = vshufps_avx(auVar177,auVar177,0xc9);
                        auVar100 = vshufps_avx(local_960._0_16_,local_960._0_16_,0xc9);
                        auVar178._0_4_ = auVar177._0_4_ * auVar100._0_4_;
                        auVar178._4_4_ = auVar177._4_4_ * auVar100._4_4_;
                        auVar178._8_4_ = auVar177._8_4_ * auVar100._8_4_;
                        auVar178._12_4_ = auVar177._12_4_ * auVar100._12_4_;
                        auVar243 = vfmsub231ps_fma(auVar178,local_960._0_16_,auVar149);
                        auVar149 = vshufps_avx(auVar243,auVar243,0xc9);
                        auVar100 = vshufps_avx(auVar213,auVar213,0xc9);
                        auVar243 = vshufps_avx(auVar243,auVar243,0xd2);
                        auVar102._0_4_ = auVar213._0_4_ * auVar243._0_4_;
                        auVar102._4_4_ = auVar213._4_4_ * auVar243._4_4_;
                        auVar102._8_4_ = auVar213._8_4_ * auVar243._8_4_;
                        auVar102._12_4_ = auVar213._12_4_ * auVar243._12_4_;
                        auVar100 = vfmsub231ps_fma(auVar102,auVar149,auVar100);
                        auVar149 = vshufps_avx(auVar100,auVar100,0xe9);
                        local_920 = vmovlps_avx(auVar149);
                        local_918 = auVar100._0_4_;
                        local_910 = 0;
                        local_90c = (undefined4)local_8e8;
                        local_904 = context->user->instID[0];
                        local_900 = context->user->instPrimID[0];
                        ray->tfar = fVar118;
                        local_b04 = -1;
                        local_a10.valid = &local_b04;
                        local_a10.geometryUserPtr = pGVar10->userPtr;
                        local_a10.context = context->user;
                        local_a10.hit = (RTCHitN *)&local_920;
                        local_a10.N = 1;
                        local_a10.ray = (RTCRayN *)ray;
                        local_914 = fVar142;
                        local_908 = uVar81;
                        if (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0186c910:
                          p_Var14 = context->args->filter;
                          if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar242 = ZEXT1664(auVar242._0_16_);
                            auVar245 = ZEXT1664(auVar245._0_16_);
                            auVar252 = ZEXT1664(auVar252._0_16_);
                            (*p_Var14)(&local_a10);
                            if (*local_a10.valid == 0) goto LAB_0186c95d;
                          }
                          bVar80 = 1;
                        }
                        else {
                          auVar242 = ZEXT1664(local_ae0._0_16_);
                          auVar245 = ZEXT1664(auVar245._0_16_);
                          auVar252 = ZEXT464((uint)fVar141);
                          (*pGVar10->occlusionFilterN)(&local_a10);
                          if (*local_a10.valid != 0) goto LAB_0186c910;
LAB_0186c95d:
                          ray->tfar = fVar141;
                          bVar80 = 0;
                        }
                      }
                      auVar139 = ZEXT3264(_local_9e0);
                    }
                    goto LAB_0186c6f8;
                  }
                }
                bVar90 = uVar86 < 4;
                uVar86 = uVar86 + 1;
              } while (uVar86 != 5);
              bVar90 = false;
              bVar80 = 5;
LAB_0186c6f4:
              auVar139 = ZEXT3264(_local_9e0);
LAB_0186c6f8:
              bVar87 = (bool)(bVar87 | bVar90 & bVar80);
              fVar118 = ray->tfar;
              auVar109._4_4_ = fVar118;
              auVar109._0_4_ = fVar118;
              auVar109._8_4_ = fVar118;
              auVar109._12_4_ = fVar118;
              auVar109._16_4_ = fVar118;
              auVar109._20_4_ = fVar118;
              auVar109._24_4_ = fVar118;
              auVar109._28_4_ = fVar118;
              auVar104 = vcmpps_avx(_local_800,auVar109,2);
              auVar135 = vandps_avx(auVar104,local_700);
              auVar104 = local_700 & auVar104;
              local_700 = auVar135;
            } while ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar104 >> 0x7f,0) != '\0') ||
                       (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar104 >> 0xbf,0) != '\0') ||
                     (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar104[0x1f] < '\0');
          }
          auVar163._0_4_ = (float)local_8a0._0_4_ + local_480._0_4_;
          auVar163._4_4_ = (float)local_8a0._4_4_ + local_480._4_4_;
          auVar163._8_4_ = fStack_898 + local_480._8_4_;
          auVar163._12_4_ = fStack_894 + local_480._12_4_;
          auVar163._16_4_ = fStack_890 + local_480._16_4_;
          auVar163._20_4_ = fStack_88c + local_480._20_4_;
          auVar163._24_4_ = fStack_888 + local_480._24_4_;
          auVar163._28_4_ = fStack_884 + local_480._28_4_;
          auVar104 = vcmpps_avx(auVar163,auVar109,2);
          auVar135 = vandps_avx(local_580,local_560);
          auVar135 = vandps_avx(auVar104,auVar135);
          auVar188._0_4_ = (float)local_8a0._0_4_ + local_4c0._0_4_;
          auVar188._4_4_ = (float)local_8a0._4_4_ + local_4c0._4_4_;
          auVar188._8_4_ = fStack_898 + local_4c0._8_4_;
          auVar188._12_4_ = fStack_894 + local_4c0._12_4_;
          auVar188._16_4_ = fStack_890 + local_4c0._16_4_;
          auVar188._20_4_ = fStack_88c + local_4c0._20_4_;
          auVar188._24_4_ = fStack_888 + local_4c0._24_4_;
          auVar188._28_4_ = fStack_884 + local_4c0._28_4_;
          auVar157 = vcmpps_avx(auVar188,auVar109,2);
          auVar104 = vandps_avx(_local_840,local_820);
          auVar104 = vandps_avx(auVar157,auVar104);
          auVar104 = vorps_avx(auVar135,auVar104);
          if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar104 >> 0x7f,0) != '\0') ||
                (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar104 >> 0xbf,0) != '\0') ||
              (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar104[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar89 * 0x60) = auVar104;
            auVar135 = vblendvps_avx(local_4c0,local_480,auVar135);
            *(undefined1 (*) [32])(auStack_160 + uVar89 * 0x60) = auVar135;
            uVar92 = vmovlps_avx(local_4d0);
            (&uStack_140)[uVar89 * 0xc] = uVar92;
            aiStack_138[uVar89 * 0x18] = local_b44 + 1;
            iVar88 = iVar88 + 1;
          }
        }
      }
    }
    auVar270 = local_400;
    auVar261 = local_420;
    fVar118 = ray->tfar;
    auVar112._4_4_ = fVar118;
    auVar112._0_4_ = fVar118;
    auVar112._8_4_ = fVar118;
    auVar112._12_4_ = fVar118;
    auVar112._16_4_ = fVar118;
    auVar112._20_4_ = fVar118;
    auVar112._24_4_ = fVar118;
    auVar112._28_4_ = fVar118;
    if (iVar88 == 0) break;
    uVar83 = -iVar88;
    pauVar82 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar88 - 1) * 0x60);
    fVar118 = (float)local_8a0._0_4_;
    fVar141 = (float)local_8a0._4_4_;
    fVar142 = fStack_898;
    fVar143 = fStack_894;
    fVar146 = fStack_890;
    fVar144 = fStack_88c;
    fVar145 = fStack_888;
    fVar209 = fStack_884;
    while( true ) {
      auVar135 = pauVar82[1];
      auVar136._0_4_ = fVar118 + auVar135._0_4_;
      auVar136._4_4_ = fVar141 + auVar135._4_4_;
      auVar136._8_4_ = fVar142 + auVar135._8_4_;
      auVar136._12_4_ = fVar143 + auVar135._12_4_;
      auVar136._16_4_ = fVar146 + auVar135._16_4_;
      auVar136._20_4_ = fVar144 + auVar135._20_4_;
      auVar136._24_4_ = fVar145 + auVar135._24_4_;
      auVar136._28_4_ = fVar209 + auVar135._28_4_;
      auVar157 = vcmpps_avx(auVar136,auVar112,2);
      auVar104 = vandps_avx(auVar157,*pauVar82);
      local_480 = auVar104;
      auVar157 = *pauVar82 & auVar157;
      if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar157 >> 0x7f,0) != '\0') ||
            (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar157 >> 0xbf,0) != '\0') ||
          (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar157[0x1f] < '\0') break;
      pauVar82 = pauVar82 + -3;
      uVar83 = uVar83 + 1;
      fVar118 = (float)local_8a0._0_4_;
      fVar141 = (float)local_8a0._4_4_;
      fVar142 = fStack_898;
      fVar143 = fStack_894;
      fVar146 = fStack_890;
      fVar144 = fStack_88c;
      fVar145 = fStack_888;
      fVar209 = fStack_884;
      if (uVar83 == 0) goto LAB_0186cc62;
    }
    auVar113._8_4_ = 0x7f800000;
    auVar113._0_8_ = 0x7f8000007f800000;
    auVar113._12_4_ = 0x7f800000;
    auVar113._16_4_ = 0x7f800000;
    auVar113._20_4_ = 0x7f800000;
    auVar113._24_4_ = 0x7f800000;
    auVar113._28_4_ = 0x7f800000;
    auVar135 = vblendvps_avx(auVar113,auVar135,auVar104);
    auVar157 = vshufps_avx(auVar135,auVar135,0xb1);
    auVar157 = vminps_avx(auVar135,auVar157);
    auVar17 = vshufpd_avx(auVar157,auVar157,5);
    auVar157 = vminps_avx(auVar157,auVar17);
    auVar17 = vpermpd_avx2(auVar157,0x4e);
    auVar157 = vminps_avx(auVar157,auVar17);
    auVar135 = vcmpps_avx(auVar135,auVar157,0);
    auVar157 = auVar104 & auVar135;
    if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar157 >> 0x7f,0) != '\0') ||
          (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar157 >> 0xbf,0) != '\0') ||
        (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar157[0x1f] < '\0') {
      auVar104 = vandps_avx(auVar135,auVar104);
    }
    uVar86 = *(ulong *)pauVar82[2];
    auVar103._8_8_ = 0;
    auVar103._0_8_ = uVar86;
    uVar84 = vmovmskps_avx(auVar104);
    iVar88 = 0;
    for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
      iVar88 = iVar88 + 1;
    }
    *(undefined4 *)(local_480 + (uint)(iVar88 << 2)) = 0;
    uVar84 = ~uVar83;
    if ((((((((local_480 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_480 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_480 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_480 >> 0x7f,0) != '\0') ||
          (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_480 >> 0xbf,0) != '\0') ||
        (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_480[0x1f] < '\0') {
      uVar84 = -uVar83;
    }
    uVar89 = (ulong)uVar84;
    local_b44 = *(int *)(pauVar82[2] + 8);
    *pauVar82 = local_480;
    uVar91 = (undefined4)uVar86;
    auVar137._4_4_ = uVar91;
    auVar137._0_4_ = uVar91;
    auVar137._8_4_ = uVar91;
    auVar137._12_4_ = uVar91;
    auVar137._16_4_ = uVar91;
    auVar137._20_4_ = uVar91;
    auVar137._24_4_ = uVar91;
    auVar137._28_4_ = uVar91;
    auVar149 = vmovshdup_avx(auVar103);
    auVar149 = vsubps_avx(auVar149,auVar103);
    auVar114._0_4_ = auVar149._0_4_;
    auVar114._4_4_ = auVar114._0_4_;
    auVar114._8_4_ = auVar114._0_4_;
    auVar114._12_4_ = auVar114._0_4_;
    auVar114._16_4_ = auVar114._0_4_;
    auVar114._20_4_ = auVar114._0_4_;
    auVar114._24_4_ = auVar114._0_4_;
    auVar114._28_4_ = auVar114._0_4_;
    auVar149 = vfmadd132ps_fma(auVar114,auVar137,_DAT_01faff20);
    local_4c0 = ZEXT1632(auVar149);
    local_4d0._8_8_ = 0;
    local_4d0._0_8_ = *(ulong *)(local_4c0 + (uint)(iVar88 << 2));
  } while( true );
LAB_0186cc62:
  if (bVar87 != false) {
    return bVar87;
  }
  auVar135 = vcmpps_avx(local_340,auVar112,2);
  uVar81 = vmovmskps_avx(auVar135);
  uVar81 = uVar81 & (uint)local_848 - 1 & (uint)local_848;
  if (uVar81 == 0) {
    return false;
  }
  goto LAB_0186a71c;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }